

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  uchar uVar3;
  short sVar4;
  stbi_uc asVar5 [4];
  stbi_uc asVar6 [4];
  int iVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  byte bVar30;
  short sVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined4 uVar38;
  undefined4 z;
  undefined4 z_00;
  undefined4 z_01;
  stbi_uc sVar39;
  byte bVar40;
  int iVar41;
  stbi__uint32 sVar42;
  int iVar43;
  uint uVar44;
  stbi__jpeg *psVar45;
  char *pcVar46;
  byte *pbVar47;
  byte *pbVar48;
  ulong uVar49;
  uchar *data_00;
  float *data_01;
  void *pvVar50;
  code *pcVar51;
  stbi__context *psVar52;
  stbi_uc *psVar53;
  uchar *puVar54;
  stbi_uc *psVar55;
  long lVar56;
  long lVar57;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  uint extraout_EDX_06;
  int extraout_EDX_07;
  uint uVar58;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *paVar59;
  ulong extraout_RDX_02;
  anon_struct_96_18_0d0905d3 *extraout_RDX_03;
  stbi_uc *extraout_RDX_04;
  stbi_uc *psVar60;
  stbi_uc *extraout_RDX_05;
  stbi_uc *extraout_RDX_06;
  int iVar61;
  ulong uVar62;
  stbi_uc *psVar63;
  int iVar64;
  int iVar65;
  uint uVar66;
  ulong uVar67;
  short sVar68;
  stbi__uint32 sVar69;
  stbi__uint16 *__ptr;
  undefined4 in_register_00000084;
  stbi__result_info *ri_00;
  int iVar70;
  int *piVar71;
  int iVar72;
  ulong uVar73;
  stbi__uint16 *psVar74;
  uint uVar75;
  uint uVar76;
  short *psVar77;
  stbi_uc (*pasVar78) [4];
  stbi__context *psVar79;
  long in_FS_OFFSET;
  bool bVar80;
  undefined1 auVar81 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  stbi_uc *coutput [4];
  short data [64];
  ulong local_8990;
  uint local_8988;
  int local_8974;
  uint local_8944;
  int local_8940;
  undefined1 local_8938 [12];
  uint uStack_892c;
  undefined1 local_8928 [16];
  int local_8918;
  undefined8 local_8908;
  undefined4 local_88fc;
  undefined8 local_88f8;
  ulong local_88f0;
  long local_88e8;
  stbi__uint32 local_88e0;
  int local_88dc;
  int local_88d8;
  int local_88d4;
  int local_88d0;
  int local_88cc;
  int local_88c8;
  int local_88c4;
  ulong local_88c0;
  ulong local_88b8;
  ulong local_88b0;
  stbi__gif local_88a8;
  
  psVar60 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  psVar45 = (stbi__jpeg *)malloc(0x4888);
  psVar45->s = s;
  psVar45->idct_block_kernel = stbi__idct_simd;
  psVar45->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar45->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar45->jfif = 0;
  psVar45->app14_color_transform = -1;
  psVar45->marker = 0xff;
  sVar39 = stbi__get_marker(psVar45);
  if (sVar39 != 0xd8) {
    *(char **)(in_FS_OFFSET + -0x10) = "Corrupt JPEG";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar45);
  if (sVar39 == 0xd8) {
    psVar45 = (stbi__jpeg *)malloc(0x4888);
    psVar45->s = s;
    psVar45->idct_block_kernel = stbi__idct_simd;
    psVar45->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar45->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      psVar45->img_comp[0].raw_data = (void *)0x0;
      psVar45->img_comp[0].raw_coeff = (void *)0x0;
      psVar45->img_comp[1].raw_data = (void *)0x0;
      psVar45->img_comp[1].raw_coeff = (void *)0x0;
      psVar45->img_comp[2].raw_data = (void *)0x0;
      psVar45->img_comp[2].raw_coeff = (void *)0x0;
      psVar45->img_comp[3].raw_data = (void *)0x0;
      psVar45->img_comp[3].raw_coeff = (void *)0x0;
      psVar45->restart_interval = 0;
      iVar41 = stbi__decode_jpeg_header(psVar45,0);
      uVar75 = extraout_EDX;
      if (iVar41 != 0) {
        paVar1 = psVar45->img_comp;
        bVar40 = stbi__get_marker(psVar45);
LAB_00152a01:
        if (bVar40 == 0xda) {
          iVar41 = stbi__get16be(psVar45->s);
          psVar52 = psVar45->s;
          pbVar48 = psVar52->img_buffer;
          paVar59 = extraout_RDX_00;
          if (pbVar48 < psVar52->img_buffer_end) {
            psVar52->img_buffer = pbVar48 + 1;
            bVar40 = *pbVar48;
          }
          else {
            if (psVar52->read_from_callbacks == 0) {
              psVar45->scan_n = 0;
              goto LAB_00154819;
            }
            psVar60 = psVar52->buffer_start;
            iVar61 = (*(psVar52->io).read)(psVar52->io_user_data,(char *)psVar60,psVar52->buflen);
            if (iVar61 == 0) {
              psVar52->read_from_callbacks = 0;
              psVar63 = psVar52->buffer_start + 1;
              psVar52->buffer_start[0] = '\0';
              bVar40 = 0;
            }
            else {
              psVar63 = psVar60 + iVar61;
              bVar40 = *psVar60;
            }
            psVar52->img_buffer_end = psVar63;
            psVar52->img_buffer = psVar52->buffer_start + 1;
            paVar59 = extraout_RDX_01;
          }
          uVar75 = (uint)bVar40;
          psVar45->scan_n = uVar75;
          if (((0xfb < (byte)(bVar40 - 5)) && (psVar52 = psVar45->s, (int)uVar75 <= psVar52->img_n))
             && (iVar41 == uVar75 * 2 + 6)) {
            lVar57 = 0;
            do {
              pbVar47 = psVar52->img_buffer;
              pbVar48 = psVar52->img_buffer_end;
              if (pbVar47 < pbVar48) {
                psVar52->img_buffer = pbVar47 + 1;
                uVar44 = (uint)*pbVar47;
                pbVar47 = pbVar47 + 1;
              }
              else if (psVar52->read_from_callbacks == 0) {
                uVar44 = 0;
              }
              else {
                psVar60 = psVar52->buffer_start;
                iVar41 = (*(psVar52->io).read)
                                   (psVar52->io_user_data,(char *)psVar60,psVar52->buflen);
                if (iVar41 == 0) {
                  psVar52->read_from_callbacks = 0;
                  psVar63 = psVar52->buffer_start + 1;
                  psVar52->buffer_start[0] = '\0';
                  uVar44 = 0;
                }
                else {
                  psVar63 = psVar60 + iVar41;
                  uVar44 = (uint)*psVar60;
                }
                psVar52->img_buffer_end = psVar63;
                psVar52->img_buffer = psVar52->buffer_start + 1;
                psVar52 = psVar45->s;
                pbVar47 = psVar52->img_buffer;
                pbVar48 = psVar52->img_buffer_end;
              }
              if (pbVar47 < pbVar48) {
                psVar52->img_buffer = pbVar47 + 1;
                uVar66 = (uint)*pbVar47;
              }
              else if (psVar52->read_from_callbacks == 0) {
                uVar66 = 0;
              }
              else {
                psVar60 = psVar52->buffer_start;
                iVar41 = (*(psVar52->io).read)
                                   (psVar52->io_user_data,(char *)psVar60,psVar52->buflen);
                if (iVar41 == 0) {
                  psVar52->read_from_callbacks = 0;
                  psVar63 = psVar52->buffer_start + 1;
                  psVar52->buffer_start[0] = '\0';
                  uVar66 = 0;
                }
                else {
                  psVar63 = psVar60 + iVar41;
                  uVar66 = (uint)*psVar60;
                }
                psVar52->img_buffer_end = psVar63;
                psVar52->img_buffer = psVar52->buffer_start + 1;
                psVar52 = psVar45->s;
              }
              uVar75 = psVar52->img_n;
              if ((long)(int)uVar75 < 1) {
                uVar67 = 0;
              }
              else {
                uVar67 = 0;
                paVar59 = paVar1;
                while (paVar59->id != uVar44) {
                  uVar67 = uVar67 + 1;
                  paVar59 = paVar59 + 1;
                  if ((long)(int)uVar75 == uVar67) goto LAB_00154829;
                }
              }
              if ((uint)uVar67 == uVar75) goto LAB_00154829;
              uVar49 = uVar67 & 0xffffffff;
              paVar59 = (anon_struct_96_18_0d0905d3 *)(uVar49 * 0x60);
              psVar45->img_comp[uVar49].hd = uVar66 >> 4;
              if (0x3f < (byte)uVar66) goto LAB_00154819;
              paVar59 = paVar1 + uVar49;
              paVar59->ha = uVar66 & 0xf;
              if (3 < (uVar66 & 0xf)) goto LAB_00154819;
              psVar45->order[lVar57] = (uint)uVar67;
              lVar57 = lVar57 + 1;
            } while (lVar57 < psVar45->scan_n);
            pbVar48 = psVar52->img_buffer;
            pbVar47 = psVar52->img_buffer_end;
            if (pbVar48 < pbVar47) {
              psVar52->img_buffer = pbVar48 + 1;
              bVar40 = *pbVar48;
              pbVar48 = pbVar48 + 1;
            }
            else if (psVar52->read_from_callbacks == 0) {
              bVar40 = 0;
            }
            else {
              psVar60 = psVar52->buffer_start;
              iVar41 = (*(psVar52->io).read)(psVar52->io_user_data,(char *)psVar60,psVar52->buflen);
              if (iVar41 == 0) {
                psVar52->read_from_callbacks = 0;
                psVar63 = psVar52->buffer_start + 1;
                psVar52->buffer_start[0] = '\0';
                bVar40 = 0;
              }
              else {
                psVar63 = psVar60 + iVar41;
                bVar40 = *psVar60;
              }
              psVar52->img_buffer_end = psVar63;
              psVar52->img_buffer = psVar52->buffer_start + 1;
              psVar52 = psVar45->s;
              pbVar48 = psVar52->img_buffer;
              pbVar47 = psVar52->img_buffer_end;
            }
            psVar45->spec_start = (uint)bVar40;
            if (pbVar48 < pbVar47) {
              psVar52->img_buffer = pbVar48 + 1;
              uVar75 = (uint)*pbVar48;
              pbVar48 = pbVar48 + 1;
            }
            else if (psVar52->read_from_callbacks == 0) {
              uVar75 = 0;
            }
            else {
              psVar60 = psVar52->buffer_start;
              iVar41 = (*(psVar52->io).read)(psVar52->io_user_data,(char *)psVar60,psVar52->buflen);
              if (iVar41 == 0) {
                psVar52->read_from_callbacks = 0;
                psVar63 = psVar52->buffer_start + 1;
                psVar52->buffer_start[0] = '\0';
                uVar75 = 0;
              }
              else {
                psVar63 = psVar60 + iVar41;
                uVar75 = (uint)*psVar60;
              }
              psVar52->img_buffer_end = psVar63;
              psVar52->img_buffer = psVar52->buffer_start + 1;
              psVar52 = psVar45->s;
              pbVar48 = psVar52->img_buffer;
              pbVar47 = psVar52->img_buffer_end;
            }
            psVar45->spec_end = uVar75;
            if (pbVar48 < pbVar47) {
              psVar52->img_buffer = pbVar48 + 1;
              uVar75 = (uint)*pbVar48;
            }
            else if (psVar52->read_from_callbacks == 0) {
              uVar75 = 0;
            }
            else {
              psVar60 = psVar52->buffer_start;
              iVar41 = (*(psVar52->io).read)(psVar52->io_user_data,(char *)psVar60,psVar52->buflen);
              if (iVar41 == 0) {
                psVar52->read_from_callbacks = 0;
                psVar63 = psVar52->buffer_start + 1;
                psVar52->buffer_start[0] = '\0';
                uVar75 = 0;
              }
              else {
                psVar63 = psVar60 + iVar41;
                uVar75 = (uint)*psVar60;
              }
              psVar52->img_buffer_end = psVar63;
              psVar52->img_buffer = psVar52->buffer_start + 1;
            }
            psVar45->succ_high = uVar75 >> 4;
            uVar44 = uVar75 & 0xf;
            paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar44;
            psVar45->succ_low = uVar44;
            iVar41 = psVar45->progressive;
            iVar61 = psVar45->spec_start;
            if (iVar41 != 0) {
              if (((iVar61 < 0x40) && (psVar45->spec_end < 0x40)) &&
                 ((iVar61 <= psVar45->spec_end && (((byte)uVar75 < 0xe0 && (uVar44 < 0xe))))))
              goto LAB_00152e94;
              goto LAB_00154819;
            }
            if ((iVar61 != 0) || ((0xf < (byte)uVar75 || (uVar44 != 0)))) goto LAB_00154819;
            psVar45->spec_end = 0x3f;
LAB_00152e94:
            iVar61 = psVar45->scan_n;
            iVar70 = psVar45->restart_interval;
            if (iVar70 == 0) {
              iVar70 = 0x7fffffff;
            }
            psVar45->code_buffer = 0;
            psVar45->code_bits = 0;
            psVar45->nomore = 0;
            psVar45->img_comp[3].dc_pred = 0;
            psVar45->img_comp[2].dc_pred = 0;
            psVar45->img_comp[1].dc_pred = 0;
            psVar45->img_comp[0].dc_pred = 0;
            psVar45->marker = 0xff;
            psVar45->todo = iVar70;
            psVar45->eob_run = 0;
            if (iVar41 == 0) {
              if (iVar61 == 1) {
                iVar41 = psVar45->order[0];
                uVar75 = psVar45->img_comp[iVar41].y + 7 >> 3;
                uVar67 = (ulong)uVar75;
                bVar80 = true;
                if (0 < (int)uVar75) {
                  uVar58 = paVar1[iVar41].x + 7 >> 3;
                  iVar61 = 0;
                  uVar44 = 0;
                  do {
                    if (0 < (int)uVar58) {
                      lVar57 = 0;
                      do {
                        iVar70 = stbi__jpeg_decode_block
                                           (psVar45,(short *)&local_88a8,
                                            (stbi__huffman *)
                                            psVar45->huff_dc[paVar1[iVar41].hd].fast,
                                            (stbi__huffman *)
                                            psVar45->huff_ac[paVar1[iVar41].ha].fast,
                                            psVar45->fast_ac[paVar1[iVar41].ha],iVar41,
                                            psVar45->dequant[paVar1[iVar41].tq]);
                        uVar66 = extraout_EDX_02;
                        if (iVar70 == 0) goto LAB_00153cde;
                        (*psVar45->idct_block_kernel)
                                  (paVar1[iVar41].data + lVar57 + iVar61 * paVar1[iVar41].w2,
                                   paVar1[iVar41].w2,(short *)&local_88a8);
                        uVar66 = (uint)extraout_RDX_02;
                        iVar70 = psVar45->todo;
                        psVar45->todo = iVar70 + -1;
                        uVar67 = extraout_RDX_02;
                        if (iVar70 < 2) {
                          if (psVar45->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar45);
                            uVar66 = extraout_EDX_03;
                          }
                          if ((psVar45->marker & 0xf8) != 0xd0) goto LAB_00153cd7;
                          psVar45->code_buffer = 0;
                          psVar45->code_bits = 0;
                          psVar45->nomore = 0;
                          psVar45->img_comp[3].dc_pred = 0;
                          psVar45->img_comp[2].dc_pred = 0;
                          psVar45->img_comp[1].dc_pred = 0;
                          psVar45->img_comp[0].dc_pred = 0;
                          psVar45->marker = 0xff;
                          iVar70 = psVar45->restart_interval;
                          uVar67 = 0x7fffffff;
                          if (iVar70 == 0) {
                            iVar70 = 0x7fffffff;
                          }
                          psVar45->todo = iVar70;
                          psVar45->eob_run = 0;
                        }
                        lVar57 = lVar57 + 8;
                      } while ((ulong)uVar58 * 8 != lVar57);
                    }
                    uVar44 = uVar44 + 1;
                    iVar61 = iVar61 + 8;
                    uVar66 = (uint)uVar67;
                  } while (uVar44 != uVar75);
LAB_00153cd7:
                  uVar75 = uVar66;
                  bVar80 = true;
                }
              }
              else {
                uVar75 = psVar45->img_mcu_y;
                bVar80 = true;
                if (0 < (int)uVar75) {
                  iVar41 = psVar45->img_mcu_x;
                  iVar61 = 0;
                  do {
                    if (0 < iVar41) {
                      uVar44 = 0;
                      do {
                        iVar41 = psVar45->scan_n;
                        if (0 < iVar41) {
                          lVar57 = 0;
                          do {
                            iVar70 = psVar45->order[lVar57];
                            iVar64 = psVar45->img_comp[iVar70].v;
                            paVar59 = paVar1;
                            if (0 < iVar64) {
                              iVar41 = paVar1[iVar70].h;
                              iVar65 = 0;
                              do {
                                if (0 < iVar41) {
                                  iVar64 = 0;
                                  do {
                                    iVar72 = paVar1[iVar70].v;
                                    iVar43 = stbi__jpeg_decode_block
                                                       (psVar45,(short *)&local_88a8,
                                                        (stbi__huffman *)
                                                        psVar45->huff_dc[paVar1[iVar70].hd].fast,
                                                        (stbi__huffman *)
                                                        psVar45->huff_ac[paVar1[iVar70].ha].fast,
                                                        psVar45->fast_ac[paVar1[iVar70].ha],iVar70,
                                                        psVar45->dequant[paVar1[iVar70].tq]);
                                    uVar66 = extraout_EDX_05;
                                    if (iVar43 == 0) goto LAB_00153cde;
                                    (*psVar45->idct_block_kernel)
                                              (paVar1[iVar70].data +
                                               (long)(int)((iVar41 * uVar44 + iVar64) * 8) +
                                               (long)((iVar72 * iVar61 + iVar65) * paVar1[iVar70].w2
                                                     * 8),paVar1[iVar70].w2,(short *)&local_88a8);
                                    iVar64 = iVar64 + 1;
                                    iVar41 = paVar1[iVar70].h;
                                  } while (iVar64 < iVar41);
                                  iVar64 = paVar1[iVar70].v;
                                  paVar59 = extraout_RDX_03;
                                }
                                iVar65 = iVar65 + 1;
                              } while (iVar65 < iVar64);
                              iVar41 = psVar45->scan_n;
                            }
                            uVar75 = (uint)paVar59;
                            lVar57 = lVar57 + 1;
                          } while (lVar57 < iVar41);
                          iVar70 = psVar45->todo;
                        }
                        psVar45->todo = iVar70 + -1;
                        bVar80 = iVar70 < 2;
                        iVar70 = iVar70 + -1;
                        if (bVar80) {
                          if (psVar45->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar45);
                            uVar75 = extraout_EDX_06;
                          }
                          uVar66 = uVar75;
                          if ((psVar45->marker & 0xf8) != 0xd0) goto LAB_00153cd7;
                          psVar45->code_buffer = 0;
                          psVar45->code_bits = 0;
                          psVar45->nomore = 0;
                          psVar45->img_comp[3].dc_pred = 0;
                          psVar45->img_comp[2].dc_pred = 0;
                          psVar45->img_comp[1].dc_pred = 0;
                          psVar45->img_comp[0].dc_pred = 0;
                          psVar45->marker = 0xff;
                          iVar70 = psVar45->restart_interval;
                          if (iVar70 == 0) {
                            iVar70 = 0x7fffffff;
                          }
                          psVar45->todo = iVar70;
                          psVar45->eob_run = 0;
                        }
                        uVar75 = uVar44 + 1;
                        iVar41 = psVar45->img_mcu_x;
                        uVar44 = uVar75;
                      } while ((int)uVar75 < iVar41);
                      uVar75 = psVar45->img_mcu_y;
                    }
                    iVar61 = iVar61 + 1;
                    uVar66 = uVar75;
                  } while (iVar61 < (int)uVar75);
                  goto LAB_00153cd7;
                }
              }
              goto LAB_00153ce0;
            }
            if (iVar61 == 1) {
              local_88e8 = (long)psVar45->order[0];
              iVar41 = psVar45->img_comp[local_88e8].y + 7 >> 3;
              local_88f0 = CONCAT44(local_88f0._4_4_,iVar41);
              if (0 < iVar41) {
                local_88f8 = paVar1 + local_88e8;
                iVar41 = psVar45->img_comp[local_88e8].x + 7 >> 3;
                local_8974 = 0;
                do {
                  if (0 < iVar41) {
                    iVar61 = 0;
                    do {
                      psVar77 = local_88f8->coeff +
                                (local_88f8->coeff_w * local_8974 + iVar61) * 0x40;
                      uVar67 = (ulong)psVar45->spec_start;
                      if (uVar67 == 0) {
                        iVar70 = stbi__jpeg_decode_block_prog_dc
                                           (psVar45,psVar77,
                                            (stbi__huffman *)psVar45->huff_dc[local_88f8->hd].fast,
                                            (int)local_88e8);
                        uVar75 = extraout_EDX_01;
                        if (iVar70 == 0) goto LAB_00154829;
                      }
                      else {
                        iVar70 = local_88f8->ha;
                        iVar64 = psVar45->eob_run;
                        bVar40 = (byte)psVar45->succ_low;
                        if (psVar45->succ_high == 0) {
                          if (iVar64 == 0) {
                            paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)psVar45->code_bits;
                            do {
                              if ((int)paVar59 < 0x10) {
                                stbi__grow_buffer_unsafe(psVar45);
                              }
                              uVar75 = psVar45->code_buffer;
                              uVar49 = (ulong)(uVar75 >> 0x17);
                              sVar68 = psVar45->fast_ac[iVar70][uVar49];
                              uVar44 = (uint)sVar68;
                              iVar64 = (int)uVar67;
                              if (sVar68 == 0) {
                                if (psVar45->code_bits < 0x10) {
                                  stbi__grow_buffer_unsafe(psVar45);
                                  uVar75 = psVar45->code_buffer;
                                  uVar49 = (ulong)(uVar75 >> 0x17);
                                }
                                uVar67 = (ulong)psVar45->huff_ac[iVar70].fast[uVar49];
                                if (uVar67 == 0xff) {
                                  lVar57 = 0;
                                  do {
                                    lVar56 = lVar57;
                                    lVar57 = lVar56 + 1;
                                  } while (psVar45->huff_ac[iVar70].maxcode[lVar56 + 10] <=
                                           uVar75 >> 0x10);
                                  uVar44 = psVar45->code_bits;
                                  paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar44;
                                  if (lVar57 == 8) goto LAB_0015633a;
                                  if ((int)uVar44 < (int)(lVar56 + 10)) goto LAB_00154819;
                                  uVar66 = stbi__bmask[lVar56 + 10];
                                  iVar65 = psVar45->huff_ac[iVar70].delta[lVar56 + 10];
                                  sVar42 = uVar75 << ((byte)(lVar56 + 10) & 0x1f);
                                  uVar44 = (uVar44 - (int)lVar57) - 9;
                                  paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar44;
                                  psVar45->code_bits = uVar44;
                                  psVar45->code_buffer = sVar42;
                                  uVar67 = (ulong)(int)((uVar75 >> (0x17U - (char)lVar57 & 0x1f) &
                                                        uVar66) + iVar65);
                                }
                                else {
                                  bVar2 = psVar45->huff_ac[iVar70].size[uVar67];
                                  uVar44 = psVar45->code_bits - (uint)bVar2;
                                  paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar44;
                                  if (psVar45->code_bits < (int)(uint)bVar2) goto LAB_00154819;
                                  sVar42 = uVar75 << (bVar2 & 0x1f);
                                  psVar45->code_buffer = sVar42;
                                  psVar45->code_bits = uVar44;
                                }
                                bVar2 = psVar45->huff_ac[iVar70].values[uVar67];
                                uVar75 = bVar2 & 0xf;
                                bVar30 = bVar2 >> 4;
                                uVar44 = (uint)bVar30;
                                iVar65 = (int)paVar59;
                                if ((bVar2 & 0xf) == 0) {
                                  if (bVar2 < 0xf0) {
                                    iVar64 = 1 << bVar30;
                                    psVar45->eob_run = iVar64;
                                    if (0xf < bVar2) {
                                      if (iVar65 < (int)uVar44) {
                                        stbi__grow_buffer_unsafe(psVar45);
                                        sVar42 = psVar45->code_buffer;
                                        iVar65 = psVar45->code_bits;
                                        iVar64 = psVar45->eob_run;
                                      }
                                      uVar66 = sVar42 << bVar30 | sVar42 >> 0x20 - bVar30;
                                      uVar75 = stbi__bmask[uVar44];
                                      psVar45->code_buffer = ~uVar75 & uVar66;
                                      iVar64 = iVar64 + (uVar66 & uVar75);
                                      psVar45->code_bits = iVar65 - uVar44;
                                    }
                                    goto LAB_001530db;
                                  }
                                  uVar75 = iVar64 + 0x10;
                                }
                                else {
                                  lVar57 = (long)iVar64 + (ulong)uVar44;
                                  bVar2 = ""[lVar57];
                                  if (iVar65 < (int)uVar75) {
                                    stbi__grow_buffer_unsafe(psVar45);
                                    sVar42 = psVar45->code_buffer;
                                    iVar65 = psVar45->code_bits;
                                  }
                                  uVar66 = sVar42 << (sbyte)uVar75 | sVar42 >> 0x20 - (sbyte)uVar75;
                                  uVar44 = *(uint *)((long)stbi__bmask + (ulong)(uVar75 * 4));
                                  psVar45->code_buffer = ~uVar44 & uVar66;
                                  paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar65 - uVar75);
                                  psVar45->code_bits = iVar65 - uVar75;
                                  iVar64 = 0;
                                  if (-1 < (int)sVar42) {
                                    iVar64 = *(int *)((long)stbi__jbias + (ulong)(uVar75 * 4));
                                  }
                                  uVar75 = (int)lVar57 + 1;
                                  psVar77[bVar2] =
                                       (short)((uVar44 & uVar66) + iVar64 << (bVar40 & 0x1f));
                                }
                              }
                              else {
                                lVar57 = (long)iVar64 + (ulong)(uVar44 >> 4 & 0xf);
                                psVar45->code_buffer = uVar75 << (sbyte)(uVar44 & 0xf);
                                uVar75 = psVar45->code_bits - (uVar44 & 0xf);
                                paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar75;
                                psVar45->code_bits = uVar75;
                                uVar75 = (int)lVar57 + 1;
                                psVar77[""[lVar57]] = (short)((uVar44 >> 8) << (bVar40 & 0x1f));
                              }
                              uVar67 = (ulong)uVar75;
                            } while ((int)uVar75 <= psVar45->spec_end);
                          }
                          else {
LAB_001530db:
                            psVar45->eob_run = iVar64 + -1;
                          }
                        }
                        else if (iVar64 == 0) {
                          iVar64 = 0x10000 << (bVar40 & 0x1f);
                          paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)psVar45->code_bits;
                          do {
                            if ((int)paVar59 < 0x10) {
                              stbi__grow_buffer_unsafe(psVar45);
                            }
                            uVar75 = psVar45->code_buffer;
                            uVar49 = (ulong)psVar45->huff_ac[iVar70].fast[uVar75 >> 0x17];
                            if (uVar49 == 0xff) {
                              lVar57 = 0;
                              do {
                                lVar56 = lVar57;
                                lVar57 = lVar56 + 1;
                              } while (psVar45->huff_ac[iVar70].maxcode[lVar56 + 10] <=
                                       uVar75 >> 0x10);
                              uVar44 = psVar45->code_bits;
                              paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar44;
                              if (lVar57 == 8) goto LAB_0015633a;
                              if ((int)uVar44 < (int)(lVar56 + 10)) goto LAB_00154819;
                              uVar66 = stbi__bmask[lVar56 + 10];
                              iVar65 = psVar45->huff_ac[iVar70].delta[lVar56 + 10];
                              sVar42 = uVar75 << ((byte)(lVar56 + 10) & 0x1f);
                              uVar44 = (uVar44 - (int)lVar57) - 9;
                              paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar44;
                              psVar45->code_bits = uVar44;
                              psVar45->code_buffer = sVar42;
                              uVar49 = (ulong)(int)((uVar75 >> (0x17U - (char)lVar57 & 0x1f) &
                                                    uVar66) + iVar65);
                            }
                            else {
                              bVar2 = psVar45->huff_ac[iVar70].size[uVar49];
                              uVar44 = psVar45->code_bits - (uint)bVar2;
                              paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar44;
                              if (psVar45->code_bits < (int)(uint)bVar2) goto LAB_00154819;
                              sVar42 = uVar75 << (bVar2 & 0x1f);
                              psVar45->code_buffer = sVar42;
                              psVar45->code_bits = uVar44;
                            }
                            iVar65 = (int)paVar59;
                            bVar2 = psVar45->huff_ac[iVar70].values[uVar49];
                            bVar30 = bVar2 >> 4;
                            uVar75 = (uint)bVar30;
                            uVar49 = (ulong)uVar75;
                            if ((bVar2 & 0xf) == 1) {
                              if (iVar65 < 1) {
                                stbi__grow_buffer_unsafe(psVar45);
                                sVar42 = psVar45->code_buffer;
                                iVar65 = psVar45->code_bits;
                              }
                              sVar69 = sVar42 * 2;
                              psVar45->code_buffer = sVar69;
                              paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar65 - 1U);
                              sVar68 = (short)(((int)~sVar42 >> 0x1f | 1U) << (bVar40 & 0x1f));
                              psVar45->code_bits = iVar65 - 1U;
                            }
                            else {
                              if ((bVar2 & 0xf) != 0) goto LAB_00154819;
                              if (bVar2 < 0xf0) {
                                uVar44 = ~(-1 << bVar30);
                                psVar45->eob_run = uVar44;
                                uVar62 = 0x40;
                                if (0xf < bVar2) {
                                  if (iVar65 < (int)uVar75) {
                                    stbi__grow_buffer_unsafe(psVar45);
                                    sVar42 = psVar45->code_buffer;
                                    iVar65 = psVar45->code_bits;
                                    uVar44 = psVar45->eob_run;
                                  }
                                  uVar58 = sVar42 << bVar30 | sVar42 >> 0x20 - bVar30;
                                  uVar66 = stbi__bmask[uVar49];
                                  sVar69 = ~uVar66 & uVar58;
                                  psVar45->code_buffer = sVar69;
                                  paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar65 - uVar75);
                                  psVar45->code_bits = iVar65 - uVar75;
                                  psVar45->eob_run = (uVar58 & uVar66) + uVar44;
                                  sVar68 = 0;
                                  uVar49 = uVar62;
                                  goto LAB_001532df;
                                }
                              }
                              else {
                                uVar62 = 0xf;
                              }
                              sVar68 = 0;
                              uVar49 = uVar62;
                              sVar69 = sVar42;
                            }
LAB_001532df:
                            uVar75 = psVar45->spec_end;
                            uVar62 = (ulong)uVar75;
                            if ((int)uVar67 <= (int)uVar75) {
                              uVar73 = (long)(int)uVar67;
                              do {
                                uVar75 = (uint)uVar62;
                                iVar65 = (int)paVar59;
                                bVar2 = ""[uVar73];
                                if (psVar77[bVar2] == 0) {
                                  if ((int)uVar49 == 0) {
                                    uVar67 = (ulong)((int)uVar73 + 1);
                                    psVar77[bVar2] = sVar68;
                                    break;
                                  }
                                  uVar49 = (ulong)((int)uVar49 - 1);
                                }
                                else {
                                  if (iVar65 < 1) {
                                    stbi__grow_buffer_unsafe(psVar45);
                                    sVar69 = psVar45->code_buffer;
                                    iVar65 = psVar45->code_bits;
                                  }
                                  sVar42 = sVar69 * 2;
                                  psVar45->code_buffer = sVar42;
                                  paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar65 - 1U);
                                  psVar45->code_bits = iVar65 - 1U;
                                  bVar80 = (int)sVar69 < 0;
                                  sVar69 = sVar42;
                                  if ((bVar80) &&
                                     (sVar4 = psVar77[bVar2], (iVar64 >> 0x10 & (int)sVar4) == 0)) {
                                    sVar31 = (short)((uint)iVar64 >> 0x10);
                                    if (sVar4 < 1) {
                                      sVar31 = -sVar31;
                                    }
                                    psVar77[bVar2] = sVar4 + sVar31;
                                  }
                                }
                                uVar67 = uVar73 + 1;
                                uVar75 = psVar45->spec_end;
                                uVar62 = (ulong)(int)uVar75;
                                bVar80 = (long)uVar73 < (long)uVar62;
                                uVar73 = uVar67;
                              } while (bVar80);
                            }
                          } while ((int)uVar67 <= (int)uVar75);
                        }
                        else {
                          psVar45->eob_run = iVar64 + -1;
                          if (psVar45->spec_start <= psVar45->spec_end) {
                            uVar75 = (0x10000 << (bVar40 & 0x1f)) >> 0x10;
                            do {
                              bVar40 = ""[uVar67];
                              if (psVar77[bVar40] != 0) {
                                iVar70 = psVar45->code_bits;
                                if (iVar70 < 1) {
                                  stbi__grow_buffer_unsafe(psVar45);
                                  iVar70 = psVar45->code_bits;
                                }
                                sVar42 = psVar45->code_buffer;
                                psVar45->code_buffer = sVar42 * 2;
                                psVar45->code_bits = iVar70 + -1;
                                if (((int)sVar42 < 0) &&
                                   (sVar68 = psVar77[bVar40], (uVar75 & (int)sVar68) == 0)) {
                                  uVar44 = -uVar75;
                                  if (0 < sVar68) {
                                    uVar44 = uVar75;
                                  }
                                  psVar77[bVar40] = (short)uVar44 + sVar68;
                                }
                              }
                              bVar80 = (long)uVar67 < (long)psVar45->spec_end;
                              uVar67 = uVar67 + 1;
                            } while (bVar80);
                          }
                        }
                      }
                      iVar70 = psVar45->todo;
                      psVar45->todo = iVar70 + -1;
                      if (iVar70 < 2) {
                        if (psVar45->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar45);
                        }
                        bVar40 = psVar45->marker;
                        if ((bVar40 & 0xf8) != 0xd0) goto LAB_00153cf0;
                        psVar45->code_buffer = 0;
                        psVar45->code_bits = 0;
                        psVar45->nomore = 0;
                        psVar45->img_comp[3].dc_pred = 0;
                        psVar45->img_comp[2].dc_pred = 0;
                        psVar45->img_comp[1].dc_pred = 0;
                        psVar45->img_comp[0].dc_pred = 0;
                        psVar45->marker = 0xff;
                        iVar70 = psVar45->restart_interval;
                        if (iVar70 == 0) {
                          iVar70 = 0x7fffffff;
                        }
                        psVar45->todo = iVar70;
                        psVar45->eob_run = 0;
                      }
                      iVar61 = iVar61 + 1;
                    } while (iVar61 != iVar41);
                  }
                  local_8974 = local_8974 + 1;
                } while (local_8974 != (int)local_88f0);
              }
            }
            else {
              iVar41 = psVar45->img_mcu_y;
              if (0 < iVar41) {
                iVar61 = psVar45->img_mcu_x;
                iVar64 = 0;
                do {
                  if (0 < iVar61) {
                    iVar41 = 0;
                    do {
                      iVar61 = psVar45->scan_n;
                      if (0 < iVar61) {
                        lVar57 = 0;
                        do {
                          iVar70 = psVar45->order[lVar57];
                          iVar65 = psVar45->img_comp[iVar70].v;
                          if (0 < iVar65) {
                            iVar61 = paVar1[iVar70].h;
                            iVar72 = 0;
                            do {
                              if (0 < iVar61) {
                                iVar65 = 0;
                                do {
                                  iVar61 = stbi__jpeg_decode_block_prog_dc
                                                     (psVar45,paVar1[iVar70].coeff +
                                                              (iVar61 * iVar41 + iVar65 +
                                                              (paVar1[iVar70].v * iVar64 + iVar72) *
                                                              paVar1[iVar70].coeff_w) * 0x40,
                                                      (stbi__huffman *)
                                                      psVar45->huff_dc[paVar1[iVar70].hd].fast,
                                                      iVar70);
                                  uVar75 = extraout_EDX_04;
                                  if (iVar61 == 0) goto LAB_00154829;
                                  iVar65 = iVar65 + 1;
                                  iVar61 = paVar1[iVar70].h;
                                } while (iVar65 < iVar61);
                                iVar65 = paVar1[iVar70].v;
                              }
                              iVar72 = iVar72 + 1;
                            } while (iVar72 < iVar65);
                            iVar61 = psVar45->scan_n;
                          }
                          lVar57 = lVar57 + 1;
                        } while (lVar57 < iVar61);
                        iVar70 = psVar45->todo;
                      }
                      psVar45->todo = iVar70 + -1;
                      bVar80 = iVar70 < 2;
                      iVar70 = iVar70 + -1;
                      if (bVar80) {
                        if (psVar45->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar45);
                        }
                        bVar40 = psVar45->marker;
                        if ((bVar40 & 0xf8) != 0xd0) goto LAB_00153cf0;
                        psVar45->code_buffer = 0;
                        psVar45->code_bits = 0;
                        psVar45->nomore = 0;
                        psVar45->img_comp[3].dc_pred = 0;
                        psVar45->img_comp[2].dc_pred = 0;
                        psVar45->img_comp[1].dc_pred = 0;
                        psVar45->img_comp[0].dc_pred = 0;
                        psVar45->marker = 0xff;
                        iVar70 = psVar45->restart_interval;
                        if (iVar70 == 0) {
                          iVar70 = 0x7fffffff;
                        }
                        psVar45->todo = iVar70;
                        psVar45->eob_run = 0;
                      }
                      iVar41 = iVar41 + 1;
                      iVar61 = psVar45->img_mcu_x;
                    } while (iVar41 < iVar61);
                    iVar41 = psVar45->img_mcu_y;
                  }
                  iVar64 = iVar64 + 1;
                } while (iVar64 < iVar41);
              }
            }
            goto LAB_00153ce8;
          }
          goto LAB_00154819;
        }
        uVar75 = (uint)bVar40;
        if (uVar75 == 0xdc) {
          iVar41 = stbi__get16be(psVar45->s);
          sVar42 = stbi__get16be(psVar45->s);
          paVar59 = extraout_RDX;
          if ((iVar41 != 4) || (sVar42 != psVar45->s->img_y)) goto LAB_00154819;
          goto LAB_00152a57;
        }
        if (uVar75 == 0xd9) {
          psVar79 = psVar45->s;
          uVar75 = psVar79->img_n;
          if (psVar45->progressive == 0) goto LAB_001546e1;
          if (0 < (int)uVar75) {
            lVar57 = 0;
            do {
              iVar41 = psVar45->img_comp[lVar57].y + 7 >> 3;
              if (0 < iVar41) {
                uVar75 = paVar1[lVar57].x + 7 >> 3;
                iVar61 = 0;
                do {
                  if (0 < (int)uVar75) {
                    uVar67 = 0;
                    do {
                      psVar77 = paVar1[lVar57].coeff +
                                (paVar1[lVar57].coeff_w * iVar61 + (int)uVar67) * 0x40;
                      iVar70 = paVar1[lVar57].tq;
                      lVar56 = 0;
                      do {
                        psVar77[lVar56] = psVar77[lVar56] * psVar45->dequant[iVar70][lVar56];
                        lVar56 = lVar56 + 1;
                      } while (lVar56 != 0x40);
                      (*psVar45->idct_block_kernel)
                                (paVar1[lVar57].data +
                                 uVar67 * 8 + (long)(iVar61 * 8 * paVar1[lVar57].w2),
                                 paVar1[lVar57].w2,psVar77);
                      uVar67 = uVar67 + 1;
                    } while (uVar67 != uVar75);
                  }
                  iVar61 = iVar61 + 1;
                } while (iVar61 != iVar41);
                psVar79 = psVar45->s;
              }
              lVar57 = lVar57 + 1;
              uVar75 = psVar79->img_n;
            } while (lVar57 < (int)uVar75);
LAB_001546e1:
            uVar44 = (2 < (int)uVar75) + 1 + (uint)(2 < (int)uVar75);
            if (req_comp != 0) {
              uVar44 = req_comp;
            }
            if (uVar75 == 3) {
              bVar80 = true;
              uVar66 = 3;
              if (psVar45->rgb != 3) {
                uVar75 = 3;
                if (psVar45->app14_color_transform != 0) goto LAB_001548a7;
                bVar80 = psVar45->jfif == 0;
              }
            }
            else {
LAB_001548a7:
              uVar66 = uVar75;
              bVar80 = false;
            }
            uVar75 = 1;
            if (bVar80) {
              uVar75 = uVar66;
            }
            if (uVar66 != 3) {
              uVar75 = uVar66;
            }
            if (2 < (int)uVar44) {
              uVar75 = uVar66;
            }
            local_8928 = (undefined1  [16])0x0;
            _local_8938 = (undefined1  [16])0x0;
            sVar42 = psVar79->img_x;
            if (0 < (int)uVar75) {
              lVar57 = 0;
              while( true ) {
                pvVar50 = malloc((ulong)(sVar42 + 3));
                *(void **)((long)&psVar45->img_comp[0].linebuf + lVar57 * 2) = pvVar50;
                iVar41 = extraout_EDX_07;
                if (pvVar50 == (void *)0x0) break;
                uVar67 = (long)psVar45->img_h_max /
                         (long)*(int *)((long)&psVar45->img_comp[0].h + lVar57 * 2);
                iVar41 = (int)uVar67;
                *(int *)((long)(local_88a8.pal + -7) + lVar57) = iVar41;
                iVar61 = psVar45->img_v_max / *(int *)((long)&psVar45->img_comp[0].v + lVar57 * 2);
                *(int *)((long)(local_88a8.pal + -6) + lVar57) = iVar61;
                *(int *)((long)(local_88a8.pal + -4) + lVar57) = iVar61 >> 1;
                *(int *)((long)(local_88a8.pal + -5) + lVar57) =
                     (int)((ulong)((sVar42 - 1) + iVar41) / (uVar67 & 0xffffffff));
                *(undefined4 *)((long)(local_88a8.pal + -3) + lVar57) = 0;
                uVar8 = *(undefined8 *)((long)&psVar45->img_comp[0].data + lVar57 * 2);
                *(undefined8 *)((long)(local_88a8.pal + -9) + lVar57) = uVar8;
                *(undefined8 *)((long)(local_88a8.pal + -0xb) + lVar57) = uVar8;
                if (iVar41 == 2) {
                  pcVar51 = stbi__resample_row_h_2;
                  if (iVar61 != 1) {
                    if (iVar61 != 2) goto LAB_001549e9;
                    pcVar51 = psVar45->resample_row_hv_2_kernel;
                  }
                }
                else if (iVar41 == 1) {
                  pcVar51 = stbi__resample_row_generic;
                  if (iVar61 == 2) {
                    pcVar51 = stbi__resample_row_v_2;
                  }
                  if (iVar61 == 1) {
                    pcVar51 = resample_row_1;
                  }
                }
                else {
LAB_001549e9:
                  pcVar51 = stbi__resample_row_generic;
                }
                *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar57) = pcVar51;
                lVar57 = lVar57 + 0x30;
                if ((ulong)uVar75 * 0x30 == lVar57) goto LAB_00154a05;
              }
LAB_001550a5:
              stbi__free_jpeg_components(psVar45,uVar66,iVar41);
              pcVar46 = "Out of memory";
              goto LAB_001528fe;
            }
LAB_00154a05:
            sVar69 = psVar79->img_y;
            psVar52 = (stbi__context *)stbi__malloc_mad3(uVar44,sVar42,sVar69,1);
            iVar41 = (int)extraout_RDX_04;
            if (psVar52 == (stbi__context *)0x0) goto LAB_001550a5;
            if (sVar69 != 0) {
              paVar1 = psVar45->img_comp;
              iVar61 = 0;
              uVar66 = 0;
              psVar60 = extraout_RDX_04;
              local_8908 = psVar45;
              do {
                sVar42 = psVar79->img_x;
                if (0 < (int)uVar75) {
                  pasVar78 = (stbi_uc (*) [4])&local_88a8.ratio;
                  uVar67 = 0;
                  piVar71 = &paVar1->y;
                  do {
                    asVar5 = pasVar78[-1];
                    asVar6 = pasVar78[-3];
                    iVar41 = (int)asVar6 >> 1;
                    auVar119 = (**(code **)(pasVar78 + -10))
                                         (*(stbi_uc **)(piVar71 + 10),
                                          *(undefined8 *)
                                           (*pasVar78 +
                                           ((ulong)(iVar41 <= (int)asVar5) << 3 | 0xffffffffffffffe0
                                           )),*(undefined8 *)
                                               (*pasVar78 +
                                               ((ulong)((int)asVar5 < iVar41) << 3 |
                                               0xffffffffffffffe0)),pasVar78[-2],pasVar78[-4]);
                    psVar60 = auVar119._8_8_;
                    *(long *)(local_8938 + uVar67 * 8) = auVar119._0_8_;
                    pasVar78[-1] = (stbi_uc  [4])((int)asVar5 + 1);
                    if ((int)asVar6 <= (int)asVar5 + 1) {
                      pasVar78[-1] = (stbi_uc  [4])0x0;
                      *(stbi_uc **)(pasVar78 + -8) = *(stbi_uc **)(pasVar78 + -6);
                      asVar5 = *pasVar78;
                      *pasVar78 = (stbi_uc  [4])((int)asVar5 + 1);
                      if ((int)asVar5 + 1 < *piVar71) {
                        *(stbi_uc **)(pasVar78 + -6) = *(stbi_uc **)(pasVar78 + -6) + piVar71[1];
                      }
                    }
                    uVar67 = uVar67 + 1;
                    piVar71 = piVar71 + 0x18;
                    pasVar78 = pasVar78 + 0xc;
                  } while (uVar75 != uVar67);
                }
                psVar45 = local_8908;
                if ((int)uVar44 < 3) {
                  psVar79 = local_8908->s;
                  if (bVar80) {
                    if (uVar44 == 1) {
                      if (psVar79->img_x != 0) {
                        uVar67 = 0;
                        do {
                          bVar40 = *(byte *)(local_8928._0_8_ + uVar67);
                          psVar52->buffer_start[uVar67 + sVar42 * iVar61 + -0x38] =
                               (stbi_uc)((uint)bVar40 * 2 + ((uint)bVar40 + (uint)bVar40 * 8) * 3 +
                                         (uint)stack0xffffffffffff76d0[uVar67] * 0x96 +
                                         (uint)*(byte *)(local_8938._0_8_ + uVar67) * 0x4d >> 8);
                          uVar67 = uVar67 + 1;
                          psVar60 = (stbi_uc *)local_8928._0_8_;
                        } while (uVar67 < psVar79->img_x);
                      }
                    }
                    else if (psVar79->img_x != 0) {
                      uVar67 = 0;
                      do {
                        bVar40 = *(byte *)(local_8928._0_8_ + uVar67);
                        psVar52->buffer_start[uVar67 * 2 + (ulong)(sVar42 * iVar61) + -0x38] =
                             (stbi_uc)((uint)bVar40 * 2 + ((uint)bVar40 + (uint)bVar40 * 8) * 3 +
                                       (uint)stack0xffffffffffff76d0[uVar67] * 0x96 +
                                       (uint)*(byte *)(local_8938._0_8_ + uVar67) * 0x4d >> 8);
                        psVar52->buffer_start[uVar67 * 2 + (ulong)(sVar42 * iVar61) + -0x37] = 0xff;
                        uVar67 = uVar67 + 1;
                        psVar60 = (stbi_uc *)local_8928._0_8_;
                      } while (uVar67 < psVar79->img_x);
                    }
                  }
                  else if (psVar79->img_n == 4) {
                    if (local_8908->app14_color_transform == 2) {
                      if (psVar79->img_x != 0) {
                        psVar63 = psVar52->buffer_start + ((ulong)(sVar42 * iVar61) - 0x37);
                        psVar60 = (stbi_uc *)0x0;
                        do {
                          iVar41 = (*(byte *)(local_8938._0_8_ + (long)psVar60) ^ 0xff) *
                                   (uint)psVar60[local_8928._8_8_];
                          psVar63[-1] = (char)((iVar41 + 0x80U >> 8) + iVar41 + 0x80 >> 8);
                          *psVar63 = 0xff;
                          psVar60 = psVar60 + 1;
                          psVar63 = psVar63 + uVar44;
                        } while (psVar60 < (stbi_uc *)(ulong)psVar79->img_x);
                      }
                    }
                    else {
                      if (local_8908->app14_color_transform != 0) goto LAB_00154e54;
                      if (psVar79->img_x != 0) {
                        psVar63 = psVar52->buffer_start + ((ulong)(sVar42 * iVar61) - 0x37);
                        uVar67 = 0;
                        do {
                          bVar40 = *(byte *)(local_8928._8_8_ + uVar67);
                          iVar41 = (uint)*(byte *)(local_8938._0_8_ + uVar67) * (uint)bVar40;
                          iVar70 = (uint)stack0xffffffffffff76d0[uVar67] * (uint)bVar40;
                          psVar63[-1] = (char)((((uint)*(byte *)(local_8928._0_8_ + uVar67) *
                                                 (uint)bVar40 + 0x80 >> 8) +
                                                (uint)*(byte *)(local_8928._0_8_ + uVar67) *
                                                (uint)bVar40 + 0x80 >> 8) * 0x1d +
                                               (iVar70 + (iVar70 + 0x80U >> 8) + 0x80 >> 8) * 0x96 +
                                               (iVar41 + (iVar41 + 0x80U >> 8) + 0x80 >> 8) * 0x4d
                                              >> 8);
                          *psVar63 = 0xff;
                          uVar67 = uVar67 + 1;
                          psVar63 = psVar63 + uVar44;
                          psVar60 = stack0xffffffffffff76d0;
                        } while (uVar67 < psVar79->img_x);
                      }
                    }
                  }
                  else {
LAB_00154e54:
                    if (uVar44 == 1) {
                      if (psVar79->img_x != 0) {
                        psVar63 = (stbi_uc *)0x0;
                        do {
                          (psVar52->buffer_start + ((ulong)(sVar42 * iVar61) - 0x38))[(long)psVar63]
                               = *(stbi_uc *)(local_8938._0_8_ + (long)psVar63);
                          psVar63 = psVar63 + 1;
                          psVar60 = (stbi_uc *)(ulong)psVar79->img_x;
                        } while (psVar63 < (stbi_uc *)(ulong)psVar79->img_x);
                      }
                    }
                    else if (psVar79->img_x != 0) {
                      psVar63 = (stbi_uc *)0x0;
                      do {
                        psVar52->buffer_start[(long)psVar63 * 2 + (ulong)(sVar42 * iVar61) + -0x38]
                             = *(stbi_uc *)(local_8938._0_8_ + (long)psVar63);
                        psVar52->buffer_start[(long)psVar63 * 2 + (ulong)(sVar42 * iVar61) + -0x37]
                             = 0xff;
                        psVar63 = psVar63 + 1;
                        psVar60 = (stbi_uc *)(ulong)psVar79->img_x;
                      } while (psVar63 < (stbi_uc *)(ulong)psVar79->img_x);
                    }
                  }
                }
                else {
                  psVar79 = local_8908->s;
                  if (psVar79->img_n == 3) {
                    if (bVar80) {
                      if (psVar79->img_x != 0) {
                        psVar63 = psVar52->buffer_start + ((ulong)(sVar42 * iVar61) - 0x35);
                        psVar60 = (stbi_uc *)0x0;
                        do {
                          psVar63[-3] = *(stbi_uc *)(local_8938._0_8_ + (long)psVar60);
                          psVar63[-2] = stack0xffffffffffff76d0[(long)psVar60];
                          psVar63[-1] = *(stbi_uc *)(local_8928._0_8_ + (long)psVar60);
                          *psVar63 = 0xff;
                          psVar60 = psVar60 + 1;
                          psVar63 = psVar63 + uVar44;
                        } while (psVar60 < (stbi_uc *)(ulong)psVar79->img_x);
                      }
                    }
                    else {
LAB_00154ec7:
                      (*local_8908->YCbCr_to_RGB_kernel)
                                (psVar52->buffer_start + ((ulong)(uVar66 * uVar44 * sVar42) - 0x38),
                                 (stbi_uc *)local_8938._0_8_,stack0xffffffffffff76d0,
                                 (stbi_uc *)local_8928._0_8_,psVar79->img_x,uVar44);
                      psVar79 = psVar45->s;
                      psVar60 = extraout_RDX_05;
                    }
                  }
                  else if (psVar79->img_n == 4) {
                    if (local_8908->app14_color_transform == 2) {
                      (*local_8908->YCbCr_to_RGB_kernel)
                                (psVar52->buffer_start + ((ulong)(uVar66 * uVar44 * sVar42) - 0x38),
                                 (stbi_uc *)local_8938._0_8_,stack0xffffffffffff76d0,
                                 (stbi_uc *)local_8928._0_8_,psVar79->img_x,uVar44);
                      psVar79 = psVar45->s;
                      psVar60 = extraout_RDX_06;
                      if (psVar79->img_x != 0) {
                        psVar63 = psVar52->buffer_start + ((ulong)(sVar42 * iVar61) - 0x36);
                        uVar67 = 0;
                        do {
                          bVar40 = *(byte *)(local_8928._8_8_ + uVar67);
                          iVar41 = (psVar63[-2] ^ 0xff) * (uint)bVar40;
                          psVar63[-2] = (byte)((iVar41 + 0x80U >> 8) + iVar41 + 0x80 >> 8);
                          iVar41 = (psVar63[-1] ^ 0xff) * (uint)bVar40;
                          psVar63[-1] = (byte)(iVar41 + (iVar41 + 0x80U >> 8) + 0x80 >> 8);
                          iVar41 = (*psVar63 ^ 0xff) * (uint)bVar40;
                          uVar58 = iVar41 + 0x80U >> 8;
                          *psVar63 = (byte)(iVar41 + uVar58 + 0x80 >> 8);
                          uVar67 = uVar67 + 1;
                          psVar63 = psVar63 + uVar44;
                          psVar60 = (stbi_uc *)(ulong)uVar58;
                        } while (uVar67 < psVar79->img_x);
                      }
                    }
                    else {
                      if (local_8908->app14_color_transform != 0) goto LAB_00154ec7;
                      if (psVar79->img_x != 0) {
                        psVar63 = psVar52->buffer_start + ((ulong)(sVar42 * iVar61) - 0x35);
                        uVar67 = 0;
                        do {
                          bVar40 = *(byte *)(local_8928._8_8_ + uVar67);
                          iVar41 = (uint)*(byte *)(local_8938._0_8_ + uVar67) * (uint)bVar40;
                          psVar63[-3] = (char)((iVar41 + 0x80U >> 8) + iVar41 + 0x80 >> 8);
                          iVar41 = (uint)stack0xffffffffffff76d0[uVar67] * (uint)bVar40;
                          psVar63[-2] = (char)(iVar41 + (iVar41 + 0x80U >> 8) + 0x80 >> 8);
                          psVar63[-1] = (char)((uint)*(byte *)(local_8928._0_8_ + uVar67) *
                                               (uint)bVar40 +
                                               ((uint)*(byte *)(local_8928._0_8_ + uVar67) *
                                                (uint)bVar40 + 0x80 >> 8) + 0x80 >> 8);
                          *psVar63 = 0xff;
                          uVar67 = uVar67 + 1;
                          psVar63 = psVar63 + uVar44;
                          psVar60 = (stbi_uc *)local_8928._0_8_;
                        } while (uVar67 < psVar79->img_x);
                      }
                    }
                  }
                  else if (psVar79->img_x != 0) {
                    psVar63 = psVar52->buffer_start + ((ulong)(sVar42 * iVar61) - 0x35);
                    uVar67 = 0;
                    do {
                      sVar39 = *(stbi_uc *)(local_8938._0_8_ + uVar67);
                      psVar63[-1] = sVar39;
                      psVar63[-2] = sVar39;
                      psVar63[-3] = sVar39;
                      *psVar63 = 0xff;
                      uVar67 = uVar67 + 1;
                      psVar63 = psVar63 + uVar44;
                    } while (uVar67 < psVar79->img_x);
                  }
                }
                iVar41 = (int)psVar60;
                uVar66 = uVar66 + 1;
                iVar61 = iVar61 + uVar44;
              } while (uVar66 < psVar79->img_y);
              uVar66 = psVar79->img_n;
            }
            stbi__free_jpeg_components(psVar45,uVar66,iVar41);
            psVar79 = psVar45->s;
            *x = psVar79->img_x;
            *y = psVar79->img_y;
            if (comp != (int *)0x0) {
              *comp = (uint)(2 < psVar79->img_n) * 2 + 1;
            }
            goto LAB_0015483d;
          }
          uVar44 = req_comp + (uint)(req_comp == 0);
          goto LAB_001548a7;
        }
        iVar41 = stbi__process_marker(psVar45,uVar75);
        uVar75 = extraout_EDX_00;
        if (iVar41 != 0) goto LAB_00152a57;
      }
LAB_00154829:
      stbi__free_jpeg_components(psVar45,psVar45->s->img_n,uVar75);
    }
    else {
      pcVar46 = "Internal error";
LAB_001528fe:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar46;
    }
    psVar52 = (stbi__context *)0x0;
LAB_0015483d:
    free(psVar45);
  }
  else {
    iVar41 = stbi__check_png_header(s);
    psVar55 = s->img_buffer_original;
    psVar63 = s->img_buffer_original_end;
    s->img_buffer = psVar55;
    s->img_buffer_end = psVar63;
    if (iVar41 == 0) {
      if (psVar55 < psVar63) {
        psVar53 = psVar55 + 1;
        s->img_buffer = psVar53;
        sVar39 = *psVar55;
LAB_00153f0a:
        if (sVar39 != 'B') goto LAB_001540f4;
        if (psVar53 < psVar63) {
          s->img_buffer = psVar53 + 1;
          sVar39 = *psVar53;
        }
        else {
          if (s->read_from_callbacks == 0) goto LAB_001540f4;
          psVar63 = s->buffer_start;
          iVar41 = (*(s->io).read)(s->io_user_data,(char *)psVar63,s->buflen);
          if (iVar41 == 0) {
            s->read_from_callbacks = 0;
            psVar55 = s->buffer_start + 1;
            s->buffer_start[0] = '\0';
            sVar39 = '\0';
          }
          else {
            psVar55 = psVar63 + iVar41;
            sVar39 = *psVar63;
          }
          s->img_buffer_end = psVar55;
          s->img_buffer = s->buffer_start + 1;
        }
        if (sVar39 != 'M') goto LAB_001540f4;
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        uVar75 = stbi__get16le(s);
        iVar41 = stbi__get16le(s);
        uVar75 = iVar41 << 0x10 | uVar75;
        if (((uVar75 < 0x39) && ((0x100010000001000U >> ((ulong)uVar75 & 0x3f) & 1) != 0)) ||
           (uVar75 == 0x6c)) {
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
LAB_00154063:
          local_8928._12_4_ = 0xff;
          pvVar50 = stbi__bmp_parse_header(s,(stbi__bmp_data *)local_8938);
          if (pvVar50 == (void *)0x0) goto LAB_0015295d;
          local_88e0 = s->img_y;
          sVar42 = -local_88e0;
          if (0 < (int)local_88e0) {
            sVar42 = local_88e0;
          }
          s->img_y = sVar42;
          z_01 = local_8928._8_4_;
          uVar38 = local_8938._8_4_;
          if (local_8938._8_4_ == 0xc) {
            if ((int)local_8938._0_4_ < 0x18) {
              uVar75 = ((local_8938._4_4_ - local_8918) + -0x18) / 3;
              goto LAB_00154262;
            }
LAB_0015426e:
            local_8990 = 0;
            if (local_8938._0_4_ != 0x18 || local_8928._8_4_ != 0xff000000) goto LAB_001542a1;
            local_8990 = 0;
            iVar41 = 3;
            iVar61 = 0x18;
            bVar80 = true;
          }
          else {
            if (0xf < (int)local_8938._0_4_) goto LAB_0015426e;
            uVar75 = local_8938._4_4_ - (local_8918 + local_8938._8_4_) >> 2;
LAB_00154262:
            local_8990 = (ulong)uVar75;
LAB_001542a1:
            bVar80 = local_8928._8_4_ == 0xff000000;
            iVar41 = 4 - (uint)(local_8928._8_4_ == 0);
            iVar61 = local_8938._0_4_;
          }
          local_8908 = (stbi__jpeg *)CONCAT44(local_8908._4_4_,uStack_892c);
          z = local_8928._0_4_;
          z_00 = local_8928._4_4_;
          uVar75 = local_8928._12_4_;
          s->img_n = iVar41;
          if (2 < req_comp) {
            iVar41 = req_comp;
          }
          sVar69 = s->img_x;
          iVar70 = stbi__mad3sizes_valid(iVar41,sVar69,sVar42,0);
          if (iVar70 == 0) {
LAB_00155889:
            pcVar46 = "Corrupt BMP";
            goto LAB_00152954;
          }
          data_00 = (uchar *)stbi__malloc_mad3(iVar41,sVar69,sVar42,0);
          if (data_00 == (uchar *)0x0) {
            pcVar46 = "Out of memory";
            goto LAB_00152954;
          }
          if (iVar61 < 0x10) {
            iVar70 = (int)local_8990;
            if (0x100 < iVar70 || iVar70 == 0) {
LAB_00155884:
              free(data_00);
              goto LAB_00155889;
            }
            if (0 < iVar70) {
              psVar60 = s->buffer_start;
              psVar63 = s->buffer_start + 1;
              psVar55 = s->img_buffer;
              psVar53 = s->img_buffer_end;
              uVar67 = 0;
              do {
                if (psVar55 < psVar53) {
                  s->img_buffer = psVar55 + 1;
                  sVar39 = *psVar55;
                  psVar55 = psVar55 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar39 = '\0';
                }
                else {
                  iVar64 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                  if (iVar64 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar39 = '\0';
                    psVar53 = psVar63;
                  }
                  else {
                    sVar39 = *psVar60;
                    psVar53 = psVar60 + iVar64;
                  }
                  s->img_buffer_end = psVar53;
                  s->img_buffer = psVar63;
                  psVar55 = psVar63;
                }
                local_88a8.pal[uVar67 - 0xd][2] = sVar39;
                if (psVar55 < psVar53) {
                  s->img_buffer = psVar55 + 1;
                  sVar39 = *psVar55;
                  psVar55 = psVar55 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar39 = '\0';
                }
                else {
                  iVar64 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                  if (iVar64 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar39 = '\0';
                    psVar53 = psVar63;
                  }
                  else {
                    sVar39 = *psVar60;
                    psVar53 = psVar60 + iVar64;
                  }
                  s->img_buffer_end = psVar53;
                  s->img_buffer = psVar63;
                  psVar55 = psVar63;
                }
                local_88a8.pal[uVar67 - 0xd][1] = sVar39;
                if (psVar55 < psVar53) {
                  s->img_buffer = psVar55 + 1;
                  sVar39 = *psVar55;
                  psVar55 = psVar55 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar39 = '\0';
                }
                else {
                  iVar64 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                  if (iVar64 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar39 = '\0';
                    psVar53 = psVar63;
                  }
                  else {
                    sVar39 = *psVar60;
                    psVar53 = psVar60 + iVar64;
                  }
                  s->img_buffer_end = psVar53;
                  s->img_buffer = psVar63;
                  psVar55 = psVar63;
                }
                local_88a8.pal[uVar67 - 0xd][0] = sVar39;
                if (uVar38 != 0xc) {
                  if (psVar55 < psVar53) {
                    psVar55 = psVar55 + 1;
                  }
                  else {
                    if (s->read_from_callbacks == 0) goto LAB_00154514;
                    iVar64 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                    if (iVar64 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      psVar53 = psVar63;
                    }
                    else {
                      psVar53 = psVar60 + iVar64;
                    }
                    s->img_buffer_end = psVar53;
                    psVar55 = psVar63;
                  }
                  s->img_buffer = psVar55;
                }
LAB_00154514:
                local_88a8.pal[uVar67 - 0xd][3] = 0xff;
                uVar67 = uVar67 + 1;
              } while (local_8990 != uVar67);
            }
            stbi__skip(s,(iVar70 * (uVar38 == 0xc | 0xfffffffc) + local_8938._4_4_) -
                         (uVar38 + local_8918));
            if (iVar61 == 1) {
              sVar42 = s->img_y;
              if (0 < (int)sVar42) {
                local_8988 = -(s->img_x + 7 >> 3) & 3;
                psVar60 = s->buffer_start;
                psVar63 = s->buffer_start + 1;
                iVar70 = 0;
                iVar61 = 0;
                do {
                  psVar55 = s->img_buffer;
                  psVar53 = s->img_buffer_end;
                  if (psVar55 < psVar53) {
                    s->img_buffer = psVar55 + 1;
                    bVar40 = *psVar55;
                    psVar55 = psVar55 + 1;
                  }
                  else if (s->read_from_callbacks == 0) {
                    bVar40 = 0;
                  }
                  else {
                    iVar64 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                    if (iVar64 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      bVar40 = 0;
                      psVar53 = psVar63;
                    }
                    else {
                      bVar40 = *psVar60;
                      psVar53 = psVar60 + iVar64;
                    }
                    s->img_buffer_end = psVar53;
                    s->img_buffer = psVar63;
                    psVar55 = psVar63;
                  }
                  sVar42 = s->img_x;
                  if (0 < (int)sVar42) {
                    uVar44 = (uint)bVar40;
                    sVar69 = 0;
                    uVar66 = 7;
                    do {
                      uVar67 = (ulong)((uVar44 >> (uVar66 & 0x1f) & 1) != 0);
                      data_00[iVar70] = local_88a8.pal[uVar67 - 0xd][0];
                      data_00[(long)iVar70 + 1] = local_88a8.pal[uVar67 - 0xd][1];
                      data_00[(long)iVar70 + 2] = local_88a8.pal[uVar67 - 0xd][2];
                      iVar64 = iVar70 + 3;
                      if (iVar41 == 4) {
                        data_00[(long)iVar70 + 3] = 0xff;
                        iVar64 = iVar70 + 4;
                      }
                      iVar70 = iVar64;
                      sVar69 = sVar69 + 1;
                      if (sVar69 == sVar42) break;
                      if ((int)uVar66 < 1) {
                        if (psVar55 < psVar53) {
                          s->img_buffer = psVar55 + 1;
                          uVar44 = (uint)*psVar55;
                          psVar55 = psVar55 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          uVar44 = 0;
                        }
                        else {
                          iVar64 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                          if (iVar64 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            uVar44 = 0;
                            psVar53 = psVar63;
                          }
                          else {
                            uVar44 = (uint)*psVar60;
                            psVar53 = psVar60 + iVar64;
                          }
                          s->img_buffer_end = psVar53;
                          s->img_buffer = psVar63;
                          sVar42 = s->img_x;
                          psVar55 = psVar63;
                        }
                        uVar66 = 7;
                      }
                      else {
                        uVar66 = uVar66 - 1;
                      }
                    } while ((int)sVar69 < (int)sVar42);
                  }
                  stbi__skip(s,local_8988);
                  iVar61 = iVar61 + 1;
                  sVar42 = s->img_y;
                } while (iVar61 < (int)sVar42);
              }
            }
            else {
              if (iVar61 == 8) {
                uVar44 = s->img_x;
              }
              else {
                if (iVar61 != 4) goto LAB_00155884;
                uVar44 = s->img_x + 1 >> 1;
              }
              sVar42 = s->img_y;
              if (0 < (int)sVar42) {
                local_8908 = (stbi__jpeg *)(CONCAT44(local_8908._4_4_,-uVar44) & 0xffffffff00000003)
                ;
                psVar60 = s->buffer_start;
                psVar63 = s->buffer_start + 1;
                uVar67 = 0;
                iVar70 = 0;
                do {
                  if (0 < (int)s->img_x) {
                    psVar55 = s->img_buffer;
                    psVar53 = s->img_buffer_end;
                    iVar64 = 0;
                    do {
                      if (psVar55 < psVar53) {
                        s->img_buffer = psVar55 + 1;
                        bVar40 = *psVar55;
                        psVar55 = psVar55 + 1;
                      }
                      else if (s->read_from_callbacks == 0) {
                        bVar40 = 0;
                      }
                      else {
                        iVar65 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                        if (iVar65 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar40 = 0;
                          psVar53 = psVar63;
                        }
                        else {
                          bVar40 = *psVar60;
                          psVar53 = psVar60 + iVar65;
                        }
                        s->img_buffer_end = psVar53;
                        s->img_buffer = psVar63;
                        psVar55 = psVar63;
                      }
                      uVar44 = (uint)(bVar40 >> 4);
                      if (iVar61 != 4) {
                        uVar44 = (uint)bVar40;
                      }
                      uVar49 = (ulong)uVar44;
                      uVar44 = bVar40 & 0xf;
                      if (iVar61 != 4) {
                        uVar44 = 0;
                      }
                      lVar57 = (long)(int)uVar67;
                      uVar62 = lVar57 + 3;
                      data_00[lVar57] = local_88a8.pal[uVar49 - 0xd][0];
                      data_00[lVar57 + 1] = local_88a8.pal[uVar49 - 0xd][1];
                      data_00[lVar57 + 2] = local_88a8.pal[uVar49 - 0xd][2];
                      if (iVar41 == 4) {
                        data_00[lVar57 + 3] = 0xff;
                        uVar62 = (ulong)((int)uVar67 + 4);
                      }
                      if (iVar64 + 1U == s->img_x) {
                        uVar67 = uVar62 & 0xffffffff;
                        break;
                      }
                      if (iVar61 == 8) {
                        if (psVar55 < psVar53) {
                          s->img_buffer = psVar55 + 1;
                          bVar40 = *psVar55;
                          psVar55 = psVar55 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          bVar40 = 0;
                        }
                        else {
                          iVar65 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                          if (iVar65 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            bVar40 = 0;
                            psVar53 = psVar63;
                          }
                          else {
                            bVar40 = *psVar60;
                            psVar53 = psVar60 + iVar65;
                          }
                          s->img_buffer_end = psVar53;
                          s->img_buffer = psVar63;
                          psVar55 = psVar63;
                        }
                        uVar44 = (uint)bVar40;
                      }
                      lVar57 = (long)(int)uVar62;
                      uVar67 = lVar57 + 3;
                      uVar49 = (ulong)uVar44;
                      data_00[lVar57] = local_88a8.pal[uVar49 - 0xd][0];
                      data_00[lVar57 + 1] = local_88a8.pal[uVar49 - 0xd][1];
                      data_00[lVar57 + 2] = local_88a8.pal[uVar49 - 0xd][2];
                      if (iVar41 == 4) {
                        data_00[lVar57 + 3] = 0xff;
                        uVar67 = (ulong)((int)uVar62 + 4);
                      }
                      iVar64 = iVar64 + 2;
                    } while (iVar64 < (int)s->img_x);
                  }
                  stbi__skip(s,(uint)local_8908);
                  iVar70 = iVar70 + 1;
                  sVar42 = s->img_y;
                } while (iVar70 < (int)sVar42);
              }
            }
          }
          else {
            stbi__skip(s,local_8938._4_4_ - (uVar38 + local_8918));
            uVar44 = (uint)local_8908;
            if (iVar61 == 0x10) {
              local_8944 = s->img_x * 2 & 2;
LAB_0015519f:
              if (z_00 == 0 || (z == 0 || (uint)local_8908 == 0)) goto LAB_00155884;
              iVar70 = stbi__high_bit((uint)local_8908);
              iVar70 = iVar70 + -7;
              uVar44 = (uVar44 >> 1 & 0x55555555) + (uVar44 & 0x55555555);
              uVar44 = (uVar44 >> 2 & 0x33333333) + (uVar44 & 0x33333333);
              uVar44 = (uVar44 >> 4) + uVar44 & 0xf0f0f0f;
              uVar44 = (uVar44 >> 8) + uVar44;
              uVar66 = (uVar44 >> 0x10) + uVar44 & 0xff;
              iVar64 = stbi__high_bit(z);
              iVar64 = iVar64 + -7;
              uVar44 = ((uint)z >> 1 & 0x55555555) + (z & 0x55555555);
              uVar44 = (uVar44 >> 2 & 0x33333333) + (uVar44 & 0x33333333);
              uVar44 = (uVar44 >> 4) + uVar44 & 0xf0f0f0f;
              uVar44 = (uVar44 >> 8) + uVar44;
              uVar76 = (uVar44 >> 0x10) + uVar44 & 0xff;
              local_8974 = stbi__high_bit(z_00);
              local_8974 = local_8974 + -7;
              uVar44 = ((uint)z_00 >> 1 & 0x55555555) + (z_00 & 0x55555555);
              uVar44 = (uVar44 >> 2 & 0x33333333) + (uVar44 & 0x33333333);
              uVar44 = (uVar44 >> 4) + uVar44 & 0xf0f0f0f;
              uVar44 = (uVar44 >> 8) + uVar44;
              uVar58 = (uVar44 >> 0x10) + uVar44 & 0xff;
              local_8940 = stbi__high_bit(z_01);
              local_8940 = local_8940 + -7;
              uVar44 = ((uint)z_01 >> 1 & 0x55555555) + (z_01 & 0x55555555);
              uVar44 = (uVar44 >> 2 & 0x33333333) + (uVar44 & 0x33333333);
              uVar44 = (uVar44 >> 4) + uVar44 & 0xf0f0f0f;
              uVar44 = (uVar44 >> 8) + uVar44;
              uVar44 = (uVar44 >> 0x10) + uVar44 & 0xff;
              local_88fc = 1;
              local_88f8 = (anon_struct_96_18_0d0905d3 *)((ulong)local_88f8._4_4_ << 0x20);
            }
            else {
              if (iVar61 == 0x20) {
                uVar66 = (uint)local_8908 ^ 0xff0000 | z ^ 0xff00 | z_00 ^ 0xff;
                local_8944 = 0;
                if (!(bool)(uVar66 == 0 & bVar80)) goto LAB_0015519f;
                local_88f8 = (anon_struct_96_18_0d0905d3 *)
                             CONCAT44(local_88f8._4_4_,(int)CONCAT71((uint7)(uint3)(uVar66 >> 8),1))
                ;
              }
              else {
                local_8944 = 0;
                if (iVar61 != 0x18) goto LAB_0015519f;
                local_8944 = s->img_x & 3;
                local_88f8 = (anon_struct_96_18_0d0905d3 *)((ulong)local_88f8._4_4_ << 0x20);
              }
              local_88fc = 0;
              iVar70 = 0;
              iVar64 = 0;
              local_8974 = 0;
              local_8940 = 0;
              uVar66 = 0;
              uVar76 = 0;
              uVar58 = 0;
              uVar44 = 0;
            }
            sVar42 = s->img_y;
            if (0 < (int)sVar42) {
              psVar60 = s->buffer_start;
              psVar63 = s->buffer_start + 1;
              local_88e8 = CONCAT44(local_88e8._4_4_,8 - uVar66);
              local_88c4 = -iVar64;
              local_88c8 = 8 - uVar76;
              local_88cc = -local_8974;
              local_88d0 = 8 - uVar58;
              local_88d8 = -local_8940;
              local_88d4 = 8 - uVar44;
              iVar72 = 0;
              local_88f0 = (ulong)(uVar66 << 2);
              local_88b0 = (ulong)(uVar76 << 2);
              local_88b8 = (ulong)(uVar58 << 2);
              local_88c0 = (ulong)(uVar44 << 2);
              iVar65 = 0;
              do {
                local_88dc = iVar65;
                if ((char)local_88fc == '\0') {
                  if (0 < (int)s->img_x) {
                    psVar55 = s->img_buffer;
                    psVar53 = s->img_buffer_end;
                    iVar65 = 0;
                    do {
                      if (psVar55 < psVar53) {
                        s->img_buffer = psVar55 + 1;
                        bVar40 = *psVar55;
                        psVar55 = psVar55 + 1;
                      }
                      else if (s->read_from_callbacks == 0) {
                        bVar40 = 0;
                      }
                      else {
                        iVar43 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                        if (iVar43 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar40 = 0;
                          psVar53 = psVar63;
                        }
                        else {
                          bVar40 = *psVar60;
                          psVar53 = psVar60 + iVar43;
                        }
                        s->img_buffer_end = psVar53;
                        s->img_buffer = psVar63;
                        psVar55 = psVar63;
                      }
                      data_00[(long)iVar72 + 2] = bVar40;
                      if (psVar55 < psVar53) {
                        s->img_buffer = psVar55 + 1;
                        bVar40 = *psVar55;
                        psVar55 = psVar55 + 1;
                      }
                      else if (s->read_from_callbacks == 0) {
                        bVar40 = 0;
                      }
                      else {
                        iVar43 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                        if (iVar43 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar40 = 0;
                          psVar53 = psVar63;
                        }
                        else {
                          bVar40 = *psVar60;
                          psVar53 = psVar60 + iVar43;
                        }
                        s->img_buffer_end = psVar53;
                        s->img_buffer = psVar63;
                        psVar55 = psVar63;
                      }
                      data_00[(long)iVar72 + 1] = bVar40;
                      if (psVar55 < psVar53) {
                        s->img_buffer = psVar55 + 1;
                        bVar40 = *psVar55;
                        psVar55 = psVar55 + 1;
                      }
                      else if (s->read_from_callbacks == 0) {
                        bVar40 = 0;
                      }
                      else {
                        iVar43 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                        if (iVar43 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar40 = 0;
                          psVar53 = psVar63;
                        }
                        else {
                          bVar40 = *psVar60;
                          psVar53 = psVar60 + iVar43;
                        }
                        s->img_buffer_end = psVar53;
                        s->img_buffer = psVar63;
                        psVar55 = psVar63;
                      }
                      data_00[iVar72] = bVar40;
                      bVar40 = 0xff;
                      if ((char)local_88f8 != '\0') {
                        if (psVar55 < psVar53) {
                          s->img_buffer = psVar55 + 1;
                          bVar40 = *psVar55;
                          psVar55 = psVar55 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          bVar40 = 0;
                        }
                        else {
                          iVar43 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                          if (iVar43 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            bVar40 = 0;
                            psVar53 = psVar63;
                          }
                          else {
                            bVar40 = *psVar60;
                            psVar53 = psVar60 + iVar43;
                          }
                          s->img_buffer_end = psVar53;
                          s->img_buffer = psVar63;
                          psVar55 = psVar63;
                        }
                      }
                      iVar43 = iVar72 + 3;
                      if (iVar41 == 4) {
                        data_00[(long)iVar72 + 3] = bVar40;
                        iVar43 = iVar72 + 4;
                      }
                      iVar72 = iVar43;
                      uVar75 = uVar75 | bVar40;
                      iVar65 = iVar65 + 1;
                    } while (iVar65 < (int)s->img_x);
                  }
                }
                else if (0 < (int)s->img_x) {
                  iVar65 = 0;
                  do {
                    uVar44 = stbi__get16le(s);
                    if (iVar61 != 0x10) {
                      iVar43 = stbi__get16le(s);
                      uVar44 = uVar44 | iVar43 << 0x10;
                    }
                    uVar66 = (uVar44 & (uint)local_8908) >> ((byte)iVar70 & 0x1f);
                    if (iVar70 < 0) {
                      uVar66 = (uVar44 & (uint)local_8908) << (-(byte)iVar70 & 0x1f);
                    }
                    uVar58 = (uVar44 & z) >> ((byte)iVar64 & 0x1f);
                    if (iVar64 < 0) {
                      uVar58 = (uVar44 & z) << ((byte)local_88c4 & 0x1f);
                    }
                    iVar43 = *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                     local_88b0);
                    bVar40 = stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_88b0];
                    uVar76 = (uVar44 & z_00) >> ((byte)local_8974 & 0x1f);
                    if (local_8974 < 0) {
                      uVar76 = (uVar44 & z_00) << ((byte)local_88cc & 0x1f);
                    }
                    iVar7 = *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table + local_88b8
                                    );
                    bVar2 = stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_88b8];
                    data_00[iVar72] =
                         (uchar)((int)((uVar66 >> ((byte)local_88e8 & 0x1f)) *
                                      *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                              local_88f0)) >>
                                (stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_88f0] &
                                0x1f));
                    data_00[(long)iVar72 + 1] =
                         (uchar)((int)((uVar58 >> ((byte)local_88c8 & 0x1f)) * iVar43) >>
                                (bVar40 & 0x1f));
                    data_00[(long)iVar72 + 2] =
                         (uchar)((int)((uVar76 >> ((byte)local_88d0 & 0x1f)) * iVar7) >>
                                (bVar2 & 0x1f));
                    if (z_01 == 0) {
                      uVar44 = 0xff;
                    }
                    else {
                      uVar66 = (uVar44 & z_01) >> ((byte)local_8940 & 0x1f);
                      if (local_8940 < 0) {
                        uVar66 = (uVar44 & z_01) << ((byte)local_88d8 & 0x1f);
                      }
                      uVar44 = (int)((uVar66 >> ((byte)local_88d4 & 0x1f)) *
                                    *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                            local_88c0)) >>
                               (stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_88c0] &
                               0x1f);
                    }
                    iVar43 = iVar72 + 3;
                    if (iVar41 == 4) {
                      data_00[(long)iVar72 + 3] = (uchar)uVar44;
                      iVar43 = iVar72 + 4;
                    }
                    iVar72 = iVar43;
                    uVar75 = uVar75 | uVar44;
                    iVar65 = iVar65 + 1;
                  } while (iVar65 < (int)s->img_x);
                }
                stbi__skip(s,local_8944);
                iVar65 = local_88dc + 1;
                sVar42 = s->img_y;
              } while (iVar65 < (int)sVar42);
            }
          }
          auVar37 = _DAT_001e96a0;
          auVar36 = _DAT_001e9690;
          auVar35 = _DAT_001e9680;
          auVar34 = _DAT_001e9670;
          auVar33 = _DAT_001e9660;
          auVar32 = _DAT_001e9650;
          auVar119 = _DAT_001e93b0;
          if (((iVar41 == 4) && (uVar75 == 0)) &&
             (uVar75 = s->img_x * sVar42 * 4 - 1, -1 < (int)uVar75)) {
            uVar44 = uVar75 >> 2;
            auVar81._4_4_ = 0;
            auVar81._0_4_ = uVar44;
            auVar81._8_4_ = uVar44;
            auVar81._12_4_ = 0;
            puVar54 = data_00 + uVar75;
            uVar67 = 0;
            do {
              auVar99._8_4_ = (int)uVar67;
              auVar99._0_8_ = uVar67;
              auVar99._12_4_ = (int)(uVar67 >> 0x20);
              auVar101 = auVar81 | auVar119;
              auVar103 = (auVar99 | auVar37) ^ auVar119;
              iVar61 = auVar101._0_4_;
              iVar72 = -(uint)(iVar61 < auVar103._0_4_);
              iVar70 = auVar101._4_4_;
              auVar105._4_4_ = -(uint)(iVar70 < auVar103._4_4_);
              iVar64 = auVar101._8_4_;
              iVar43 = -(uint)(iVar64 < auVar103._8_4_);
              iVar65 = auVar101._12_4_;
              auVar105._12_4_ = -(uint)(iVar65 < auVar103._12_4_);
              auVar82._4_4_ = iVar72;
              auVar82._0_4_ = iVar72;
              auVar82._8_4_ = iVar43;
              auVar82._12_4_ = iVar43;
              auVar82 = pshuflw(in_XMM1,auVar82,0xe8);
              auVar104._4_4_ = -(uint)(auVar103._4_4_ == iVar70);
              auVar104._12_4_ = -(uint)(auVar103._12_4_ == iVar65);
              auVar104._0_4_ = auVar104._4_4_;
              auVar104._8_4_ = auVar104._12_4_;
              auVar91 = pshuflw(in_XMM2,auVar104,0xe8);
              auVar105._0_4_ = auVar105._4_4_;
              auVar105._8_4_ = auVar105._12_4_;
              auVar103 = pshuflw(auVar82,auVar105,0xe8);
              auVar101._8_4_ = 0xffffffff;
              auVar101._0_8_ = 0xffffffffffffffff;
              auVar101._12_4_ = 0xffffffff;
              auVar101 = (auVar103 | auVar91 & auVar82) ^ auVar101;
              auVar101 = packssdw(auVar101,auVar101);
              if ((auVar101 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *puVar54 = 0xff;
              }
              auVar91._4_4_ = iVar72;
              auVar91._0_4_ = iVar72;
              auVar91._8_4_ = iVar43;
              auVar91._12_4_ = iVar43;
              auVar105 = auVar104 & auVar91 | auVar105;
              auVar101 = packssdw(auVar105,auVar105);
              auVar103._8_4_ = 0xffffffff;
              auVar103._0_8_ = 0xffffffffffffffff;
              auVar103._12_4_ = 0xffffffff;
              auVar101 = packssdw(auVar101 ^ auVar103,auVar101 ^ auVar103);
              auVar101 = packsswb(auVar101,auVar101);
              if ((auVar101._0_4_ >> 8 & 1) != 0) {
                puVar54[-4] = 0xff;
              }
              auVar101 = (auVar99 | auVar36) ^ auVar119;
              auVar92._0_4_ = -(uint)(iVar61 < auVar101._0_4_);
              auVar92._4_4_ = -(uint)(iVar70 < auVar101._4_4_);
              auVar92._8_4_ = -(uint)(iVar64 < auVar101._8_4_);
              auVar92._12_4_ = -(uint)(iVar65 < auVar101._12_4_);
              auVar106._4_4_ = auVar92._0_4_;
              auVar106._0_4_ = auVar92._0_4_;
              auVar106._8_4_ = auVar92._8_4_;
              auVar106._12_4_ = auVar92._8_4_;
              iVar72 = -(uint)(auVar101._4_4_ == iVar70);
              iVar43 = -(uint)(auVar101._12_4_ == iVar65);
              auVar18._4_4_ = iVar72;
              auVar18._0_4_ = iVar72;
              auVar18._8_4_ = iVar43;
              auVar18._12_4_ = iVar43;
              auVar116._4_4_ = auVar92._4_4_;
              auVar116._0_4_ = auVar92._4_4_;
              auVar116._8_4_ = auVar92._12_4_;
              auVar116._12_4_ = auVar92._12_4_;
              auVar101 = auVar18 & auVar106 | auVar116;
              auVar101 = packssdw(auVar101,auVar101);
              auVar9._8_4_ = 0xffffffff;
              auVar9._0_8_ = 0xffffffffffffffff;
              auVar9._12_4_ = 0xffffffff;
              auVar101 = packssdw(auVar101 ^ auVar9,auVar101 ^ auVar9);
              auVar101 = packsswb(auVar101,auVar101);
              if ((auVar101._0_4_ >> 0x10 & 1) != 0) {
                puVar54[-8] = 0xff;
              }
              auVar101 = pshufhw(auVar101,auVar106,0x84);
              auVar19._4_4_ = iVar72;
              auVar19._0_4_ = iVar72;
              auVar19._8_4_ = iVar43;
              auVar19._12_4_ = iVar43;
              auVar103 = pshufhw(auVar92,auVar19,0x84);
              auVar82 = pshufhw(auVar101,auVar116,0x84);
              auVar83._8_4_ = 0xffffffff;
              auVar83._0_8_ = 0xffffffffffffffff;
              auVar83._12_4_ = 0xffffffff;
              auVar83 = (auVar82 | auVar103 & auVar101) ^ auVar83;
              auVar101 = packssdw(auVar83,auVar83);
              auVar101 = packsswb(auVar101,auVar101);
              if ((auVar101._0_4_ >> 0x18 & 1) != 0) {
                puVar54[-0xc] = 0xff;
              }
              auVar101 = (auVar99 | auVar35) ^ auVar119;
              auVar93._0_4_ = -(uint)(iVar61 < auVar101._0_4_);
              auVar93._4_4_ = -(uint)(iVar70 < auVar101._4_4_);
              auVar93._8_4_ = -(uint)(iVar64 < auVar101._8_4_);
              auVar93._12_4_ = -(uint)(iVar65 < auVar101._12_4_);
              auVar20._4_4_ = auVar93._0_4_;
              auVar20._0_4_ = auVar93._0_4_;
              auVar20._8_4_ = auVar93._8_4_;
              auVar20._12_4_ = auVar93._8_4_;
              auVar103 = pshuflw(auVar116,auVar20,0xe8);
              auVar84._0_4_ = -(uint)(auVar101._0_4_ == iVar61);
              auVar84._4_4_ = -(uint)(auVar101._4_4_ == iVar70);
              auVar84._8_4_ = -(uint)(auVar101._8_4_ == iVar64);
              auVar84._12_4_ = -(uint)(auVar101._12_4_ == iVar65);
              auVar107._4_4_ = auVar84._4_4_;
              auVar107._0_4_ = auVar84._4_4_;
              auVar107._8_4_ = auVar84._12_4_;
              auVar107._12_4_ = auVar84._12_4_;
              auVar101 = pshuflw(auVar84,auVar107,0xe8);
              auVar108._4_4_ = auVar93._4_4_;
              auVar108._0_4_ = auVar93._4_4_;
              auVar108._8_4_ = auVar93._12_4_;
              auVar108._12_4_ = auVar93._12_4_;
              auVar82 = pshuflw(auVar93,auVar108,0xe8);
              auVar10._8_4_ = 0xffffffff;
              auVar10._0_8_ = 0xffffffffffffffff;
              auVar10._12_4_ = 0xffffffff;
              auVar101 = packssdw(auVar101 & auVar103,(auVar82 | auVar101 & auVar103) ^ auVar10);
              auVar101 = packsswb(auVar101,auVar101);
              if ((auVar101 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar54[-0x10] = 0xff;
              }
              auVar21._4_4_ = auVar93._0_4_;
              auVar21._0_4_ = auVar93._0_4_;
              auVar21._8_4_ = auVar93._8_4_;
              auVar21._12_4_ = auVar93._8_4_;
              auVar108 = auVar107 & auVar21 | auVar108;
              auVar82 = packssdw(auVar108,auVar108);
              auVar11._8_4_ = 0xffffffff;
              auVar11._0_8_ = 0xffffffffffffffff;
              auVar11._12_4_ = 0xffffffff;
              auVar101 = packssdw(auVar101,auVar82 ^ auVar11);
              auVar101 = packsswb(auVar101,auVar101);
              if ((auVar101._4_2_ >> 8 & 1) != 0) {
                puVar54[-0x14] = 0xff;
              }
              auVar101 = (auVar99 | auVar34) ^ auVar119;
              auVar94._0_4_ = -(uint)(iVar61 < auVar101._0_4_);
              auVar94._4_4_ = -(uint)(iVar70 < auVar101._4_4_);
              auVar94._8_4_ = -(uint)(iVar64 < auVar101._8_4_);
              auVar94._12_4_ = -(uint)(iVar65 < auVar101._12_4_);
              auVar109._4_4_ = auVar94._0_4_;
              auVar109._0_4_ = auVar94._0_4_;
              auVar109._8_4_ = auVar94._8_4_;
              auVar109._12_4_ = auVar94._8_4_;
              iVar72 = -(uint)(auVar101._4_4_ == iVar70);
              iVar43 = -(uint)(auVar101._12_4_ == iVar65);
              auVar22._4_4_ = iVar72;
              auVar22._0_4_ = iVar72;
              auVar22._8_4_ = iVar43;
              auVar22._12_4_ = iVar43;
              auVar117._4_4_ = auVar94._4_4_;
              auVar117._0_4_ = auVar94._4_4_;
              auVar117._8_4_ = auVar94._12_4_;
              auVar117._12_4_ = auVar94._12_4_;
              auVar101 = auVar22 & auVar109 | auVar117;
              auVar101 = packssdw(auVar101,auVar101);
              auVar12._8_4_ = 0xffffffff;
              auVar12._0_8_ = 0xffffffffffffffff;
              auVar12._12_4_ = 0xffffffff;
              auVar101 = packssdw(auVar101 ^ auVar12,auVar101 ^ auVar12);
              auVar101 = packsswb(auVar101,auVar101);
              if ((auVar101 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar54[-0x18] = 0xff;
              }
              auVar101 = pshufhw(auVar101,auVar109,0x84);
              auVar23._4_4_ = iVar72;
              auVar23._0_4_ = iVar72;
              auVar23._8_4_ = iVar43;
              auVar23._12_4_ = iVar43;
              auVar103 = pshufhw(auVar94,auVar23,0x84);
              auVar82 = pshufhw(auVar101,auVar117,0x84);
              auVar85._8_4_ = 0xffffffff;
              auVar85._0_8_ = 0xffffffffffffffff;
              auVar85._12_4_ = 0xffffffff;
              auVar85 = (auVar82 | auVar103 & auVar101) ^ auVar85;
              auVar101 = packssdw(auVar85,auVar85);
              auVar101 = packsswb(auVar101,auVar101);
              if ((auVar101._6_2_ >> 8 & 1) != 0) {
                puVar54[-0x1c] = 0xff;
              }
              auVar101 = (auVar99 | auVar33) ^ auVar119;
              auVar95._0_4_ = -(uint)(iVar61 < auVar101._0_4_);
              auVar95._4_4_ = -(uint)(iVar70 < auVar101._4_4_);
              auVar95._8_4_ = -(uint)(iVar64 < auVar101._8_4_);
              auVar95._12_4_ = -(uint)(iVar65 < auVar101._12_4_);
              auVar24._4_4_ = auVar95._0_4_;
              auVar24._0_4_ = auVar95._0_4_;
              auVar24._8_4_ = auVar95._8_4_;
              auVar24._12_4_ = auVar95._8_4_;
              auVar103 = pshuflw(auVar117,auVar24,0xe8);
              auVar86._0_4_ = -(uint)(auVar101._0_4_ == iVar61);
              auVar86._4_4_ = -(uint)(auVar101._4_4_ == iVar70);
              auVar86._8_4_ = -(uint)(auVar101._8_4_ == iVar64);
              auVar86._12_4_ = -(uint)(auVar101._12_4_ == iVar65);
              auVar110._4_4_ = auVar86._4_4_;
              auVar110._0_4_ = auVar86._4_4_;
              auVar110._8_4_ = auVar86._12_4_;
              auVar110._12_4_ = auVar86._12_4_;
              auVar101 = pshuflw(auVar86,auVar110,0xe8);
              auVar111._4_4_ = auVar95._4_4_;
              auVar111._0_4_ = auVar95._4_4_;
              auVar111._8_4_ = auVar95._12_4_;
              auVar111._12_4_ = auVar95._12_4_;
              auVar82 = pshuflw(auVar95,auVar111,0xe8);
              auVar96._8_4_ = 0xffffffff;
              auVar96._0_8_ = 0xffffffffffffffff;
              auVar96._12_4_ = 0xffffffff;
              auVar96 = (auVar82 | auVar101 & auVar103) ^ auVar96;
              auVar82 = packssdw(auVar96,auVar96);
              auVar101 = packsswb(auVar101 & auVar103,auVar82);
              if ((auVar101 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar54[-0x20] = 0xff;
              }
              auVar25._4_4_ = auVar95._0_4_;
              auVar25._0_4_ = auVar95._0_4_;
              auVar25._8_4_ = auVar95._8_4_;
              auVar25._12_4_ = auVar95._8_4_;
              auVar111 = auVar110 & auVar25 | auVar111;
              auVar82 = packssdw(auVar111,auVar111);
              auVar13._8_4_ = 0xffffffff;
              auVar13._0_8_ = 0xffffffffffffffff;
              auVar13._12_4_ = 0xffffffff;
              auVar82 = packssdw(auVar82 ^ auVar13,auVar82 ^ auVar13);
              auVar101 = packsswb(auVar101,auVar82);
              if ((auVar101._8_2_ >> 8 & 1) != 0) {
                puVar54[-0x24] = 0xff;
              }
              auVar101 = (auVar99 | auVar32) ^ auVar119;
              auVar97._0_4_ = -(uint)(iVar61 < auVar101._0_4_);
              auVar97._4_4_ = -(uint)(iVar70 < auVar101._4_4_);
              auVar97._8_4_ = -(uint)(iVar64 < auVar101._8_4_);
              auVar97._12_4_ = -(uint)(iVar65 < auVar101._12_4_);
              auVar112._4_4_ = auVar97._0_4_;
              auVar112._0_4_ = auVar97._0_4_;
              auVar112._8_4_ = auVar97._8_4_;
              auVar112._12_4_ = auVar97._8_4_;
              iVar72 = -(uint)(auVar101._4_4_ == iVar70);
              iVar43 = -(uint)(auVar101._12_4_ == iVar65);
              auVar26._4_4_ = iVar72;
              auVar26._0_4_ = iVar72;
              auVar26._8_4_ = iVar43;
              auVar26._12_4_ = iVar43;
              auVar118._4_4_ = auVar97._4_4_;
              auVar118._0_4_ = auVar97._4_4_;
              auVar118._8_4_ = auVar97._12_4_;
              auVar118._12_4_ = auVar97._12_4_;
              auVar101 = auVar26 & auVar112 | auVar118;
              auVar101 = packssdw(auVar101,auVar101);
              auVar14._8_4_ = 0xffffffff;
              auVar14._0_8_ = 0xffffffffffffffff;
              auVar14._12_4_ = 0xffffffff;
              auVar101 = packssdw(auVar101 ^ auVar14,auVar101 ^ auVar14);
              auVar101 = packsswb(auVar101,auVar101);
              if ((auVar101 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                puVar54[-0x28] = 0xff;
              }
              auVar101 = pshufhw(auVar101,auVar112,0x84);
              auVar27._4_4_ = iVar72;
              auVar27._0_4_ = iVar72;
              auVar27._8_4_ = iVar43;
              auVar27._12_4_ = iVar43;
              auVar103 = pshufhw(auVar97,auVar27,0x84);
              auVar82 = pshufhw(auVar101,auVar118,0x84);
              auVar87._8_4_ = 0xffffffff;
              auVar87._0_8_ = 0xffffffffffffffff;
              auVar87._12_4_ = 0xffffffff;
              auVar87 = (auVar82 | auVar103 & auVar101) ^ auVar87;
              auVar101 = packssdw(auVar87,auVar87);
              auVar101 = packsswb(auVar101,auVar101);
              if ((auVar101._10_2_ >> 8 & 1) != 0) {
                puVar54[-0x2c] = 0xff;
              }
              auVar101 = (auVar99 | _DAT_001e9640) ^ auVar119;
              auVar98._0_4_ = -(uint)(iVar61 < auVar101._0_4_);
              auVar98._4_4_ = -(uint)(iVar70 < auVar101._4_4_);
              auVar98._8_4_ = -(uint)(iVar64 < auVar101._8_4_);
              auVar98._12_4_ = -(uint)(iVar65 < auVar101._12_4_);
              auVar28._4_4_ = auVar98._0_4_;
              auVar28._0_4_ = auVar98._0_4_;
              auVar28._8_4_ = auVar98._8_4_;
              auVar28._12_4_ = auVar98._8_4_;
              auVar103 = pshuflw(auVar118,auVar28,0xe8);
              auVar88._0_4_ = -(uint)(auVar101._0_4_ == iVar61);
              auVar88._4_4_ = -(uint)(auVar101._4_4_ == iVar70);
              auVar88._8_4_ = -(uint)(auVar101._8_4_ == iVar64);
              auVar88._12_4_ = -(uint)(auVar101._12_4_ == iVar65);
              auVar113._4_4_ = auVar88._4_4_;
              auVar113._0_4_ = auVar88._4_4_;
              auVar113._8_4_ = auVar88._12_4_;
              auVar113._12_4_ = auVar88._12_4_;
              auVar101 = pshuflw(auVar88,auVar113,0xe8);
              auVar114._4_4_ = auVar98._4_4_;
              auVar114._0_4_ = auVar98._4_4_;
              auVar114._8_4_ = auVar98._12_4_;
              auVar114._12_4_ = auVar98._12_4_;
              auVar82 = pshuflw(auVar98,auVar114,0xe8);
              auVar15._8_4_ = 0xffffffff;
              auVar15._0_8_ = 0xffffffffffffffff;
              auVar15._12_4_ = 0xffffffff;
              auVar101 = packssdw(auVar101 & auVar103,(auVar82 | auVar101 & auVar103) ^ auVar15);
              auVar101 = packsswb(auVar101,auVar101);
              if ((auVar101 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar54[-0x30] = 0xff;
              }
              auVar29._4_4_ = auVar98._0_4_;
              auVar29._0_4_ = auVar98._0_4_;
              auVar29._8_4_ = auVar98._8_4_;
              auVar29._12_4_ = auVar98._8_4_;
              auVar114 = auVar113 & auVar29 | auVar114;
              auVar82 = packssdw(auVar114,auVar114);
              auVar16._8_4_ = 0xffffffff;
              auVar16._0_8_ = 0xffffffffffffffff;
              auVar16._12_4_ = 0xffffffff;
              auVar101 = packssdw(auVar101,auVar82 ^ auVar16);
              auVar101 = packsswb(auVar101,auVar101);
              if ((auVar101._12_2_ >> 8 & 1) != 0) {
                puVar54[-0x34] = 0xff;
              }
              auVar101 = (auVar99 | _DAT_001e9630) ^ auVar119;
              auVar89._0_4_ = -(uint)(iVar61 < auVar101._0_4_);
              auVar89._4_4_ = -(uint)(iVar70 < auVar101._4_4_);
              auVar89._8_4_ = -(uint)(iVar64 < auVar101._8_4_);
              auVar89._12_4_ = -(uint)(iVar65 < auVar101._12_4_);
              auVar115._4_4_ = auVar89._0_4_;
              auVar115._0_4_ = auVar89._0_4_;
              auVar115._8_4_ = auVar89._8_4_;
              auVar115._12_4_ = auVar89._8_4_;
              auVar100._4_4_ = -(uint)(auVar101._4_4_ == iVar70);
              auVar100._12_4_ = -(uint)(auVar101._12_4_ == iVar65);
              auVar100._0_4_ = auVar100._4_4_;
              auVar100._8_4_ = auVar100._12_4_;
              auVar102._4_4_ = auVar89._4_4_;
              auVar102._0_4_ = auVar89._4_4_;
              auVar102._8_4_ = auVar89._12_4_;
              auVar102._12_4_ = auVar89._12_4_;
              auVar82 = auVar100 & auVar115 | auVar102;
              auVar101 = packssdw(auVar89,auVar82);
              auVar17._8_4_ = 0xffffffff;
              auVar17._0_8_ = 0xffffffffffffffff;
              auVar17._12_4_ = 0xffffffff;
              auVar101 = packssdw(auVar101 ^ auVar17,auVar101 ^ auVar17);
              auVar101 = packsswb(auVar101,auVar101);
              if ((auVar101 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar54[-0x38] = 0xff;
              }
              auVar101 = pshufhw(auVar101,auVar115,0x84);
              in_XMM2 = pshufhw(auVar82,auVar100,0x84);
              in_XMM2 = in_XMM2 & auVar101;
              auVar101 = pshufhw(auVar101,auVar102,0x84);
              auVar90._8_4_ = 0xffffffff;
              auVar90._0_8_ = 0xffffffffffffffff;
              auVar90._12_4_ = 0xffffffff;
              auVar90 = (auVar101 | in_XMM2) ^ auVar90;
              auVar101 = packssdw(auVar90,auVar90);
              in_XMM1 = packsswb(auVar101,auVar101);
              if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                puVar54[-0x3c] = 0xff;
              }
              uVar67 = uVar67 + 0x10;
              puVar54 = puVar54 + -0x40;
            } while ((uVar44 + 0x10 & 0x3ffffff0) != uVar67);
          }
          if ((int)local_88e0 < 1) {
            uVar75 = s->img_x;
          }
          else {
            uVar75 = s->img_x;
            if (0 < (int)sVar42 >> 1) {
              uVar44 = uVar75 * iVar41;
              uVar66 = (sVar42 - 1) * uVar44;
              uVar67 = 0;
              uVar49 = 0;
              do {
                if (0 < (int)uVar44) {
                  uVar62 = 0;
                  do {
                    uVar3 = data_00[uVar62 + uVar67];
                    data_00[uVar62 + uVar67] = data_00[uVar62 + uVar66];
                    data_00[uVar62 + uVar66] = uVar3;
                    uVar62 = uVar62 + 1;
                  } while (uVar44 != uVar62);
                }
                uVar49 = uVar49 + 1;
                uVar66 = uVar66 - uVar44;
                uVar67 = (ulong)((int)uVar67 + uVar44);
              } while (uVar49 != (uint)((int)sVar42 >> 1));
            }
          }
          if ((req_comp == 0) || (iVar41 == req_comp)) {
LAB_00156309:
            *x = uVar75;
            *y = s->img_y;
            if (comp == (int *)0x0) {
              return data_00;
            }
            *comp = s->img_n;
            return data_00;
          }
          data_00 = stbi__convert_format(data_00,iVar41,req_comp,uVar75,sVar42);
          if (data_00 != (uchar *)0x0) {
            uVar75 = s->img_x;
            goto LAB_00156309;
          }
          goto LAB_0015295d;
        }
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        if (uVar75 == 0x7c) goto LAB_00154063;
      }
      else {
        if (s->read_from_callbacks != 0) {
          psVar55 = s->buffer_start;
          iVar41 = (*(s->io).read)(s->io_user_data,(char *)psVar55,s->buflen);
          if (iVar41 == 0) {
            s->read_from_callbacks = 0;
            psVar63 = s->buffer_start + 1;
            s->buffer_start[0] = '\0';
            sVar39 = '\0';
          }
          else {
            psVar63 = psVar55 + iVar41;
            sVar39 = *psVar55;
          }
          s->img_buffer_end = psVar63;
          psVar53 = s->buffer_start + 1;
          s->img_buffer = psVar53;
          goto LAB_00153f0a;
        }
LAB_001540f4:
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
      }
      iVar41 = stbi__gif_test(s);
      if (iVar41 != 0) {
        memset(&local_88a8,0,0x8870);
        psVar52 = (stbi__context *)stbi__gif_load_next(s,&local_88a8,comp,0,psVar60);
        if (psVar52 == (stbi__context *)0x0 || psVar52 == s) {
          if (local_88a8.out != (stbi_uc *)0x0) {
            free(local_88a8.out);
          }
          psVar52 = (stbi__context *)0x0;
        }
        else {
          *x = local_88a8.w;
          *y = local_88a8.h;
          if ((req_comp & 0xfffffffbU) != 0) {
            psVar52 = (stbi__context *)
                      stbi__convert_format((uchar *)psVar52,4,req_comp,local_88a8.w,local_88a8.h);
          }
        }
        free(local_88a8.history);
        psVar45 = (stbi__jpeg *)local_88a8.background;
        goto LAB_0015483d;
      }
      iVar41 = stbi__psd_test(s);
      if (iVar41 != 0) {
        pvVar50 = stbi__psd_load(s,x,y,comp,req_comp,ri,bpc);
        return pvVar50;
      }
      iVar41 = stbi__pic_test(s);
      if (iVar41 != 0) {
        pvVar50 = stbi__pic_load(s,x,y,comp,req_comp,ri_00);
        return pvVar50;
      }
      iVar41 = stbi__pnm_test(s);
      if (iVar41 != 0) {
        pvVar50 = stbi__pnm_load(s,x,y,comp,req_comp,ri_00);
        return pvVar50;
      }
      iVar41 = stbi__hdr_test(s);
      if (iVar41 != 0) {
        data_01 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *comp;
        }
        psVar60 = stbi__hdr_to_ldr(data_01,*x,*y,req_comp);
        return psVar60;
      }
      iVar41 = stbi__tga_test(s);
      if (iVar41 != 0) {
        pvVar50 = stbi__tga_load(s,x,y,comp,req_comp,ri_00);
        return pvVar50;
      }
      pcVar46 = "Image not of any known type, or corrupt";
LAB_00152954:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar46;
    }
    else {
      if (4 < (uint)req_comp) {
        pcVar46 = "Internal error";
        goto LAB_00152954;
      }
      local_88a8._0_8_ = s;
      iVar41 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
      uVar8 = local_88a8._0_8_;
      if (iVar41 == 0) {
        psVar74 = (stbi__uint16 *)0x0;
        __ptr = (stbi__uint16 *)local_88a8.history;
        goto LAB_00153f98;
      }
      iVar41 = 8;
      if (8 < local_88a8.flags) {
        iVar41 = local_88a8.flags;
      }
      ri->bits_per_channel = iVar41;
      if ((req_comp == 0) || (iVar41 = *(int *)(local_88a8._0_8_ + 0xc), iVar41 == req_comp)) {
LAB_00153f70:
        *x = *(stbi__uint32 *)uVar8;
        *y = *(stbi__uint32 *)(uVar8 + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)(uVar8 + 8);
        }
        __ptr = (stbi__uint16 *)0x0;
        psVar74 = (stbi__uint16 *)local_88a8.history;
LAB_00153f98:
        free(__ptr);
        free(local_88a8.background);
        free(local_88a8.out);
        return psVar74;
      }
      if (local_88a8.flags < 9) {
        local_88a8.history =
             stbi__convert_format
                       (local_88a8.history,iVar41,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                        *(stbi__uint32 *)(local_88a8._0_8_ + 4));
      }
      else {
        local_88a8.history =
             (stbi_uc *)
             stbi__convert_format16
                       ((stbi__uint16 *)local_88a8.history,iVar41,req_comp,
                        *(stbi__uint32 *)local_88a8._0_8_,*(stbi__uint32 *)(local_88a8._0_8_ + 4));
      }
      *(int *)(uVar8 + 0xc) = req_comp;
      if ((stbi__uint16 *)local_88a8.history != (stbi__uint16 *)0x0) goto LAB_00153f70;
    }
LAB_0015295d:
    psVar52 = (stbi__context *)0x0;
  }
  return psVar52;
LAB_00153cde:
  uVar75 = uVar66;
  bVar80 = false;
LAB_00153ce0:
  if (!bVar80) goto LAB_00154829;
LAB_00153ce8:
  bVar40 = psVar45->marker;
LAB_00153cf0:
  if (bVar40 == 0xff) {
LAB_00153cf8:
    do {
      psVar52 = psVar45->s;
      if ((psVar52->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00153d18:
        if (psVar52->img_buffer_end <= psVar52->img_buffer) goto LAB_00152a57;
      }
      else {
        iVar41 = (*(psVar52->io).eof)(psVar52->io_user_data);
        if (iVar41 != 0) {
          if (psVar52->read_from_callbacks != 0) goto LAB_00153d18;
          goto LAB_00152a57;
        }
      }
      psVar52 = psVar45->s;
      psVar60 = psVar52->img_buffer;
      if (psVar60 < psVar52->img_buffer_end) {
        psVar52->img_buffer = psVar60 + 1;
        sVar39 = *psVar60;
      }
      else {
        if (psVar52->read_from_callbacks == 0) goto LAB_00153cf8;
        psVar60 = psVar52->buffer_start;
        iVar41 = (*(psVar52->io).read)(psVar52->io_user_data,(char *)psVar60,psVar52->buflen);
        if (iVar41 == 0) {
          psVar52->read_from_callbacks = 0;
          psVar63 = psVar52->buffer_start + 1;
          psVar52->buffer_start[0] = '\0';
          sVar39 = '\0';
        }
        else {
          psVar63 = psVar60 + iVar41;
          sVar39 = *psVar60;
        }
        psVar52->img_buffer_end = psVar63;
        psVar52->img_buffer = psVar52->buffer_start + 1;
      }
    } while (sVar39 != 0xff);
    psVar52 = psVar45->s;
    psVar60 = psVar52->img_buffer;
    if (psVar60 < psVar52->img_buffer_end) {
      psVar52->img_buffer = psVar60 + 1;
      sVar39 = *psVar60;
    }
    else if (psVar52->read_from_callbacks == 0) {
      sVar39 = '\0';
    }
    else {
      psVar60 = psVar52->buffer_start;
      iVar41 = (*(psVar52->io).read)(psVar52->io_user_data,(char *)psVar60,psVar52->buflen);
      if (iVar41 == 0) {
        psVar52->read_from_callbacks = 0;
        psVar63 = psVar52->buffer_start + 1;
        psVar52->buffer_start[0] = '\0';
        sVar39 = '\0';
      }
      else {
        psVar63 = psVar60 + iVar41;
        sVar39 = *psVar60;
      }
      psVar52->img_buffer_end = psVar63;
      psVar52->img_buffer = psVar52->buffer_start + 1;
    }
    psVar45->marker = sVar39;
  }
LAB_00152a57:
  bVar40 = stbi__get_marker(psVar45);
  goto LAB_00152a01;
LAB_0015633a:
  paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)(uVar44 - 0x10);
  psVar45->code_bits = uVar44 - 0x10;
LAB_00154819:
  uVar75 = (uint)paVar59;
  *(char **)(in_FS_OFFSET + -0x10) = "Corrupt JPEG";
  goto LAB_00154829;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}